

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  byte bVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  bool bVar49;
  bool bVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  int iVar109;
  float fVar110;
  undefined4 uVar111;
  vint4 bi_2;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  float fVar157;
  float fVar158;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar159;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  __m128 a;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar230;
  float fVar240;
  float fVar241;
  vfloat4 a0_2;
  undefined1 auVar231 [16];
  float fVar242;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  vfloat4 a0_3;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  vfloat4 b0_2;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  vfloat4 b0_3;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  int iVar286;
  undefined1 in_ZMM31 [64];
  undefined1 auVar287 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_489;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  Primitive *local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint uStack_148;
  float afStack_144 [7];
  RTCHitN local_128 [16];
  undefined1 local_118 [16];
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar43;
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar267 [32];
  
  PVar5 = prim[1];
  uVar42 = (ulong)(byte)PVar5;
  lVar46 = uVar42 * 0x25;
  fVar110 = *(float *)(prim + lVar46 + 0x12);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar53 = vsubps_avx(auVar53,*(undefined1 (*) [16])(prim + lVar46 + 6));
  auVar140._0_4_ = fVar110 * auVar53._0_4_;
  auVar140._4_4_ = fVar110 * auVar53._4_4_;
  auVar140._8_4_ = fVar110 * auVar53._8_4_;
  auVar140._12_4_ = fVar110 * auVar53._12_4_;
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 4 + 6)));
  auVar56._0_4_ = fVar110 * auVar54._0_4_;
  auVar56._4_4_ = fVar110 * auVar54._4_4_;
  auVar56._8_4_ = fVar110 * auVar54._8_4_;
  auVar56._12_4_ = fVar110 * auVar54._12_4_;
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 5 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 6 + 6)));
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0xf + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar42 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1a + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1b + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar42 * 0x1c + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar168._4_4_ = auVar56._0_4_;
  auVar168._0_4_ = auVar56._0_4_;
  auVar168._8_4_ = auVar56._0_4_;
  auVar168._12_4_ = auVar56._0_4_;
  auVar71 = vshufps_avx(auVar56,auVar56,0x55);
  auVar72 = vshufps_avx(auVar56,auVar56,0xaa);
  fVar110 = auVar72._0_4_;
  auVar129._0_4_ = fVar110 * auVar63._0_4_;
  fVar245 = auVar72._4_4_;
  auVar129._4_4_ = fVar245 * auVar63._4_4_;
  fVar230 = auVar72._8_4_;
  auVar129._8_4_ = fVar230 * auVar63._8_4_;
  fVar240 = auVar72._12_4_;
  auVar129._12_4_ = fVar240 * auVar63._12_4_;
  auVar64._0_4_ = auVar66._0_4_ * fVar110;
  auVar64._4_4_ = auVar66._4_4_ * fVar245;
  auVar64._8_4_ = auVar66._8_4_ * fVar230;
  auVar64._12_4_ = auVar66._12_4_ * fVar240;
  auVar57._0_4_ = auVar70._0_4_ * fVar110;
  auVar57._4_4_ = auVar70._4_4_ * fVar245;
  auVar57._8_4_ = auVar70._8_4_ * fVar230;
  auVar57._12_4_ = auVar70._12_4_ * fVar240;
  auVar72 = vfmadd231ps_fma(auVar129,auVar71,auVar54);
  auVar73 = vfmadd231ps_fma(auVar64,auVar71,auVar69);
  auVar71 = vfmadd231ps_fma(auVar57,auVar68,auVar71);
  auVar74 = vfmadd231ps_fma(auVar72,auVar168,auVar53);
  auVar73 = vfmadd231ps_fma(auVar73,auVar168,auVar62);
  auVar75 = vfmadd231ps_fma(auVar71,auVar67,auVar168);
  auVar268._4_4_ = auVar140._0_4_;
  auVar268._0_4_ = auVar140._0_4_;
  auVar268._8_4_ = auVar140._0_4_;
  auVar268._12_4_ = auVar140._0_4_;
  auVar71 = vshufps_avx(auVar140,auVar140,0x55);
  auVar72 = vshufps_avx(auVar140,auVar140,0xaa);
  fVar110 = auVar72._0_4_;
  auVar169._0_4_ = fVar110 * auVar63._0_4_;
  fVar245 = auVar72._4_4_;
  auVar169._4_4_ = fVar245 * auVar63._4_4_;
  fVar230 = auVar72._8_4_;
  auVar169._8_4_ = fVar230 * auVar63._8_4_;
  fVar240 = auVar72._12_4_;
  auVar169._12_4_ = fVar240 * auVar63._12_4_;
  auVar160._0_4_ = auVar66._0_4_ * fVar110;
  auVar160._4_4_ = auVar66._4_4_ * fVar245;
  auVar160._8_4_ = auVar66._8_4_ * fVar230;
  auVar160._12_4_ = auVar66._12_4_ * fVar240;
  auVar141._0_4_ = auVar70._0_4_ * fVar110;
  auVar141._4_4_ = auVar70._4_4_ * fVar245;
  auVar141._8_4_ = auVar70._8_4_ * fVar230;
  auVar141._12_4_ = auVar70._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar169,auVar71,auVar54);
  auVar63 = vfmadd231ps_fma(auVar160,auVar71,auVar69);
  auVar69 = vfmadd231ps_fma(auVar141,auVar71,auVar68);
  auVar55 = vfmadd231ps_fma(auVar54,auVar268,auVar53);
  auVar56 = vfmadd231ps_fma(auVar63,auVar268,auVar62);
  auVar95._16_16_ = in_YmmResult._16_16_;
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar282 = ZEXT1664(auVar53);
  auVar57 = vfmadd231ps_fma(auVar69,auVar268,auVar67);
  auVar54 = vandps_avx512vl(auVar74,auVar53);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  uVar51 = vcmpps_avx512vl(auVar54,auVar196,1);
  bVar49 = (bool)((byte)uVar51 & 1);
  auVar58._0_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar74._0_4_;
  bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar74._4_4_;
  bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar74._8_4_;
  bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar74._12_4_;
  auVar54 = vandps_avx512vl(auVar73,auVar53);
  uVar51 = vcmpps_avx512vl(auVar54,auVar196,1);
  bVar49 = (bool)((byte)uVar51 & 1);
  auVar59._0_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar73._0_4_;
  bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar73._4_4_;
  bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar73._8_4_;
  bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar73._12_4_;
  auVar53 = vandps_avx512vl(auVar75,auVar53);
  uVar51 = vcmpps_avx512vl(auVar53,auVar196,1);
  bVar49 = (bool)((byte)uVar51 & 1);
  auVar60._0_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar75._0_4_;
  bVar49 = (bool)((byte)(uVar51 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar75._4_4_;
  bVar49 = (bool)((byte)(uVar51 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar75._8_4_;
  bVar49 = (bool)((byte)(uVar51 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar49 * 0x219392ef | (uint)!bVar49 * auVar75._12_4_;
  auVar54 = vrcp14ps_avx512vl(auVar58);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = &DAT_3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar53 = vfnmadd213ps_fma(auVar58,auVar54,auVar197);
  auVar74 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar59);
  auVar53 = vfnmadd213ps_fma(auVar59,auVar54,auVar197);
  auVar75 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
  auVar54 = vrcp14ps_avx512vl(auVar60);
  auVar53 = vfnmadd213ps_fma(auVar60,auVar54,auVar197);
  auVar76 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
  fVar110 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar46 + 0x16)) *
            *(float *)(prim + lVar46 + 0x1a);
  auVar185._4_4_ = fVar110;
  auVar185._0_4_ = fVar110;
  auVar185._8_4_ = fVar110;
  auVar185._12_4_ = fVar110;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar42 * 7 + 6);
  auVar53 = vpmovsxwd_avx(auVar53);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar42 * 0xb + 6);
  auVar54 = vpmovsxwd_avx(auVar54);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar62 = vsubps_avx(auVar54,auVar53);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar42 * 9 + 6);
  auVar54 = vpmovsxwd_avx(auVar63);
  auVar63 = vfmadd213ps_fma(auVar62,auVar185,auVar53);
  auVar53 = vcvtdq2ps_avx(auVar54);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar42 * 0xd + 6);
  auVar54 = vpmovsxwd_avx(auVar62);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar53);
  auVar62 = vfmadd213ps_fma(auVar54,auVar185,auVar53);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar42 * 0x12 + 6);
  auVar53 = vpmovsxwd_avx(auVar69);
  auVar53 = vcvtdq2ps_avx(auVar53);
  uVar51 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar42 * 2 + uVar51 + 6);
  auVar54 = vpmovsxwd_avx(auVar66);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar53);
  auVar69 = vfmadd213ps_fma(auVar54,auVar185,auVar53);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar51 + 6);
  auVar53 = vpmovsxwd_avx(auVar67);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar42 * 0x18 + 6);
  auVar54 = vpmovsxwd_avx(auVar68);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar53);
  auVar66 = vfmadd213ps_fma(auVar54,auVar185,auVar53);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar42 * 0x1d + 6);
  auVar53 = vpmovsxwd_avx(auVar70);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar42 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar54 = vpmovsxwd_avx(auVar71);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar53);
  auVar67 = vfmadd213ps_fma(auVar54,auVar185,auVar53);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar42) + 6);
  auVar53 = vpmovsxwd_avx(auVar72);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar42 * 0x23 + 6);
  auVar54 = vpmovsxwd_avx(auVar73);
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar54 = vsubps_avx(auVar54,auVar53);
  auVar54 = vfmadd213ps_fma(auVar54,auVar185,auVar53);
  auVar53 = vsubps_avx(auVar63,auVar55);
  auVar186._0_4_ = auVar74._0_4_ * auVar53._0_4_;
  auVar186._4_4_ = auVar74._4_4_ * auVar53._4_4_;
  auVar186._8_4_ = auVar74._8_4_ * auVar53._8_4_;
  auVar186._12_4_ = auVar74._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar62,auVar55);
  auVar130._0_4_ = auVar74._0_4_ * auVar53._0_4_;
  auVar130._4_4_ = auVar74._4_4_ * auVar53._4_4_;
  auVar130._8_4_ = auVar74._8_4_ * auVar53._8_4_;
  auVar130._12_4_ = auVar74._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar69,auVar56);
  auVar170._0_4_ = auVar75._0_4_ * auVar53._0_4_;
  auVar170._4_4_ = auVar75._4_4_ * auVar53._4_4_;
  auVar170._8_4_ = auVar75._8_4_ * auVar53._8_4_;
  auVar170._12_4_ = auVar75._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar66,auVar56);
  auVar65._0_4_ = auVar75._0_4_ * auVar53._0_4_;
  auVar65._4_4_ = auVar75._4_4_ * auVar53._4_4_;
  auVar65._8_4_ = auVar75._8_4_ * auVar53._8_4_;
  auVar65._12_4_ = auVar75._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar67,auVar57);
  auVar161._0_4_ = auVar76._0_4_ * auVar53._0_4_;
  auVar161._4_4_ = auVar76._4_4_ * auVar53._4_4_;
  auVar161._8_4_ = auVar76._8_4_ * auVar53._8_4_;
  auVar161._12_4_ = auVar76._12_4_ * auVar53._12_4_;
  auVar53 = vsubps_avx(auVar54,auVar57);
  auVar61._0_4_ = auVar76._0_4_ * auVar53._0_4_;
  auVar61._4_4_ = auVar76._4_4_ * auVar53._4_4_;
  auVar61._8_4_ = auVar76._8_4_ * auVar53._8_4_;
  auVar61._12_4_ = auVar76._12_4_ * auVar53._12_4_;
  auVar53 = vpminsd_avx(auVar186,auVar130);
  auVar54 = vpminsd_avx(auVar170,auVar65);
  auVar53 = vmaxps_avx(auVar53,auVar54);
  auVar54 = vpminsd_avx(auVar161,auVar61);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar74._4_4_ = uVar111;
  auVar74._0_4_ = uVar111;
  auVar74._8_4_ = uVar111;
  auVar74._12_4_ = uVar111;
  auVar54 = vmaxps_avx512vl(auVar54,auVar74);
  auVar53 = vmaxps_avx(auVar53,auVar54);
  auVar75._8_4_ = 0x3f7ffffa;
  auVar75._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar75._12_4_ = 0x3f7ffffa;
  local_288 = vmulps_avx512vl(auVar53,auVar75);
  auVar53 = vpmaxsd_avx(auVar186,auVar130);
  auVar54 = vpmaxsd_avx(auVar170,auVar65);
  auVar53 = vminps_avx(auVar53,auVar54);
  auVar54 = vpmaxsd_avx(auVar161,auVar61);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar76._4_4_ = uVar111;
  auVar76._0_4_ = uVar111;
  auVar76._8_4_ = uVar111;
  auVar76._12_4_ = uVar111;
  auVar54 = vminps_avx512vl(auVar54,auVar76);
  auVar53 = vminps_avx(auVar53,auVar54);
  auVar55._8_4_ = 0x3f800003;
  auVar55._0_8_ = 0x3f8000033f800003;
  auVar55._12_4_ = 0x3f800003;
  auVar53 = vmulps_avx512vl(auVar53,auVar55);
  auVar54 = vpbroadcastd_avx512vl();
  uVar16 = vcmpps_avx512vl(local_288,auVar53,2);
  uVar51 = vpcmpgtd_avx512vl(auVar54,_DAT_01ff0cf0);
  uVar51 = ((byte)uVar16 & 0xf) & uVar51;
  bVar49 = (char)uVar51 == '\0';
  local_489 = !bVar49;
  if (bVar49) {
    return local_489;
  }
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar53 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar287 = ZEXT1664(auVar53);
  local_3e0 = prim;
LAB_01c5bd1d:
  lVar46 = 0;
  for (uVar42 = uVar51; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    lVar46 = lVar46 + 1;
  }
  uVar42 = (ulong)*(uint *)(local_3e0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar42].ptr;
  fVar110 = (pGVar7->time_range).lower;
  fVar110 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar110) / ((pGVar7->time_range).upper - fVar110));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar110),ZEXT416((uint)fVar110),9);
  auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar55 = vmaxss_avx512f(auVar287._0_16_,auVar53);
  uVar45 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_3e0 + lVar46 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar47 = (long)(int)auVar55._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar47);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar47);
  auVar53 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar45);
  lVar46 = uVar45 + 1;
  auVar54 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar46);
  lVar1 = uVar45 + 2;
  auVar63 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar45 + 3;
  auVar62 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar47);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar47);
  auVar69 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar45);
  auVar66 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar46);
  auVar67 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar68 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar47);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar47);
  auVar70 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar45);
  auVar71 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar46);
  auVar72 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar73 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  local_298 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar47);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar47);
  auVar74 = *(undefined1 (*) [16])(lVar10 + uVar45 * lVar9);
  auVar75 = *(undefined1 (*) [16])(lVar10 + lVar46 * lVar9);
  auVar76 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar55 = vsubss_avx512f(ZEXT416((uint)fVar110),auVar55);
  auVar91._0_16_ = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
  auVar56 = vmulps_avx512vl(auVar62,auVar91._0_16_);
  auVar116._8_4_ = 0x3e2aaaab;
  auVar116._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar116._12_4_ = 0x3e2aaaab;
  auVar57 = vfmadd213ps_avx512vl(auVar116,auVar63,auVar56);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar54,auVar58);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar53,auVar116);
  auVar19._8_4_ = 0x3f000000;
  auVar19._0_8_ = 0x3f0000003f000000;
  auVar19._12_4_ = 0x3f000000;
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar63,auVar19);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar54,auVar91._0_16_);
  auVar20._8_4_ = 0x3f000000;
  auVar20._0_8_ = 0x3f0000003f000000;
  auVar20._12_4_ = 0x3f000000;
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar53,auVar20);
  auVar59 = vmulps_avx512vl(auVar68,auVar91._0_16_);
  auVar60 = vfmadd213ps_avx512vl(auVar116,auVar67,auVar59);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar66,auVar58);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar116);
  auVar21._8_4_ = 0x3f000000;
  auVar21._0_8_ = 0x3f0000003f000000;
  auVar21._12_4_ = 0x3f000000;
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar67,auVar21);
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar66,auVar91._0_16_);
  auVar22._8_4_ = 0x3f000000;
  auVar22._0_8_ = 0x3f0000003f000000;
  auVar22._12_4_ = 0x3f000000;
  auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar69,auVar22);
  auVar61 = vmulps_avx512vl(auVar62,auVar116);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar63,auVar58);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar54,auVar116);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar53,auVar91._0_16_);
  auVar23._8_4_ = 0x3f000000;
  auVar23._0_8_ = 0x3f0000003f000000;
  auVar23._12_4_ = 0x3f000000;
  auVar62 = vmulps_avx512vl(auVar62,auVar23);
  auVar63 = vfmadd231ps_avx512vl(auVar62,auVar91._0_16_,auVar63);
  auVar24._8_4_ = 0x3f000000;
  auVar24._0_8_ = 0x3f0000003f000000;
  auVar24._12_4_ = 0x3f000000;
  auVar54 = vfnmadd231ps_avx512vl(auVar63,auVar54,auVar24);
  auVar64 = vfnmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar53);
  auVar112._0_4_ = auVar68._0_4_ * 0.16666667;
  auVar112._4_4_ = auVar68._4_4_ * 0.16666667;
  auVar112._8_4_ = auVar68._8_4_ * 0.16666667;
  auVar112._12_4_ = auVar68._12_4_ * 0.16666667;
  auVar53 = vfmadd231ps_avx512vl(auVar112,auVar67,auVar58);
  auVar53 = vfmadd231ps_fma(auVar53,auVar66,auVar116);
  auVar65 = vfmadd231ps_avx512vl(auVar53,auVar69,auVar91._0_16_);
  auVar25._8_4_ = 0x3f000000;
  auVar25._0_8_ = 0x3f0000003f000000;
  auVar25._12_4_ = 0x3f000000;
  auVar53 = vmulps_avx512vl(auVar68,auVar25);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar91._0_16_,auVar67);
  auVar26._8_4_ = 0x3f000000;
  auVar26._0_8_ = 0x3f0000003f000000;
  auVar26._12_4_ = 0x3f000000;
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar66,auVar26);
  auVar66 = vfnmadd231ps_avx512vl(auVar53,auVar91._0_16_,auVar69);
  auVar53 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar54 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  fVar244 = auVar56._0_4_;
  auVar171._0_4_ = fVar244 * auVar54._0_4_;
  fVar157 = auVar56._4_4_;
  auVar171._4_4_ = fVar157 * auVar54._4_4_;
  fVar158 = auVar56._8_4_;
  auVar171._8_4_ = fVar158 * auVar54._8_4_;
  fVar159 = auVar56._12_4_;
  auVar171._12_4_ = fVar159 * auVar54._12_4_;
  auVar54 = vfmsub231ps_avx512vl(auVar171,auVar53,auVar60);
  auVar63 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar187._0_4_ = fVar244 * auVar54._0_4_;
  auVar187._4_4_ = fVar157 * auVar54._4_4_;
  auVar187._8_4_ = fVar158 * auVar54._8_4_;
  auVar187._12_4_ = fVar159 * auVar54._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar187,auVar53,auVar59);
  auVar62 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar54 = vshufps_avx(auVar65,auVar65,0xc9);
  fVar245 = auVar64._0_4_;
  auVar208._0_4_ = auVar54._0_4_ * fVar245;
  fVar230 = auVar64._4_4_;
  auVar208._4_4_ = auVar54._4_4_ * fVar230;
  fVar240 = auVar64._8_4_;
  auVar208._8_4_ = auVar54._8_4_ * fVar240;
  fVar241 = auVar64._12_4_;
  auVar208._12_4_ = auVar54._12_4_ * fVar241;
  auVar54 = vfmsub231ps_fma(auVar208,auVar53,auVar65);
  auVar69 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar209._0_4_ = auVar54._0_4_ * fVar245;
  auVar209._4_4_ = auVar54._4_4_ * fVar230;
  auVar209._8_4_ = auVar54._8_4_ * fVar240;
  auVar209._12_4_ = auVar54._12_4_ * fVar241;
  auVar53 = vfmsub231ps_fma(auVar209,auVar53,auVar66);
  auVar66 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar63,auVar63,0x7f);
  auVar91._16_16_ = auVar95._16_16_;
  auVar77._4_28_ = auVar91._4_28_;
  auVar77._0_4_ = auVar53._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar77._0_16_);
  auVar67 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar68 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar68 = vmulss_avx512f(auVar68,auVar54);
  auVar54 = vmulss_avx512f(auVar68,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  auVar54 = vaddss_avx512f(auVar67,auVar54);
  auVar221._0_4_ = auVar54._0_4_;
  auVar221._4_4_ = auVar221._0_4_;
  auVar221._8_4_ = auVar221._0_4_;
  auVar221._12_4_ = auVar221._0_4_;
  auVar67 = vmulps_avx512vl(auVar63,auVar221);
  auVar54 = vdpps_avx(auVar63,auVar62,0x7f);
  auVar68 = vbroadcastss_avx512vl(auVar53);
  auVar62 = vmulps_avx512vl(auVar68,auVar62);
  fVar110 = auVar54._0_4_;
  auVar172._0_4_ = fVar110 * auVar63._0_4_;
  auVar172._4_4_ = fVar110 * auVar63._4_4_;
  auVar172._8_4_ = fVar110 * auVar63._8_4_;
  auVar172._12_4_ = fVar110 * auVar63._12_4_;
  auVar63 = vsubps_avx(auVar62,auVar172);
  auVar54 = vrcp14ss_avx512f(auVar91._0_16_,auVar77._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar54,ZEXT416(0x40000000));
  fVar242 = auVar54._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar69,auVar69,0x7f);
  auVar93._16_16_ = auVar95._16_16_;
  auVar93._0_16_ = auVar91._0_16_;
  auVar94._4_28_ = auVar93._4_28_;
  auVar94._0_4_ = auVar53._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar94._0_16_);
  auVar62 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar68 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  fVar110 = auVar54._0_4_;
  fVar110 = auVar62._0_4_ + auVar68._0_4_ * fVar110 * fVar110 * fVar110;
  auVar222._0_4_ = fVar110 * auVar69._0_4_;
  auVar222._4_4_ = fVar110 * auVar69._4_4_;
  auVar222._8_4_ = fVar110 * auVar69._8_4_;
  auVar222._12_4_ = fVar110 * auVar69._12_4_;
  auVar54 = vdpps_avx(auVar69,auVar66,0x7f);
  auVar62 = vbroadcastss_avx512vl(auVar53);
  auVar62 = vmulps_avx512vl(auVar62,auVar66);
  fVar243 = auVar54._0_4_;
  auVar113._0_4_ = fVar243 * auVar69._0_4_;
  auVar113._4_4_ = fVar243 * auVar69._4_4_;
  auVar113._8_4_ = fVar243 * auVar69._8_4_;
  auVar113._12_4_ = fVar243 * auVar69._12_4_;
  auVar54 = vsubps_avx(auVar62,auVar113);
  auVar62 = vrcp14ss_avx512f(auVar91._0_16_,auVar94._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar62,ZEXT416(0x40000000));
  fVar243 = auVar62._0_4_ * auVar53._0_4_;
  auVar62 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar69 = vmulps_avx512vl(auVar62,auVar67);
  auVar68 = vsubps_avx512vl(auVar57,auVar69);
  auVar53 = vshufps_avx(auVar56,auVar56,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar67);
  auVar162._0_4_ = auVar53._0_4_ + auVar62._0_4_ * auVar221._0_4_ * fVar242 * auVar63._0_4_;
  auVar162._4_4_ = auVar53._4_4_ + auVar62._4_4_ * auVar221._0_4_ * fVar242 * auVar63._4_4_;
  auVar162._8_4_ = auVar53._8_4_ + auVar62._8_4_ * auVar221._0_4_ * fVar242 * auVar63._8_4_;
  auVar162._12_4_ = auVar53._12_4_ + auVar62._12_4_ * auVar221._0_4_ * fVar242 * auVar63._12_4_;
  auVar53 = vsubps_avx(auVar56,auVar162);
  auVar67 = vaddps_avx512vl(auVar57,auVar69);
  auVar63 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar262._0_4_ = auVar222._0_4_ * auVar63._0_4_;
  auVar262._4_4_ = auVar222._4_4_ * auVar63._4_4_;
  auVar262._8_4_ = auVar222._8_4_ * auVar63._8_4_;
  auVar262._12_4_ = auVar222._12_4_ * auVar63._12_4_;
  auVar56 = vsubps_avx512vl(auVar61,auVar262);
  auVar62 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar222);
  auVar173._0_4_ = auVar62._0_4_ + auVar63._0_4_ * fVar110 * auVar54._0_4_ * fVar243;
  auVar173._4_4_ = auVar62._4_4_ + auVar63._4_4_ * fVar110 * auVar54._4_4_ * fVar243;
  auVar173._8_4_ = auVar62._8_4_ + auVar63._8_4_ * fVar110 * auVar54._8_4_ * fVar243;
  auVar173._12_4_ = auVar62._12_4_ + auVar63._12_4_ * fVar110 * auVar54._12_4_ * fVar243;
  auVar54 = vsubps_avx(auVar64,auVar173);
  auVar57 = vaddps_avx512vl(auVar61,auVar262);
  auVar198._0_4_ = auVar68._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar198._4_4_ = auVar68._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar198._8_4_ = auVar68._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar198._12_4_ = auVar68._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar174._0_4_ = auVar54._0_4_ * 0.33333334;
  auVar174._4_4_ = auVar54._4_4_ * 0.33333334;
  auVar174._8_4_ = auVar54._8_4_ * 0.33333334;
  auVar174._12_4_ = auVar54._12_4_ * 0.33333334;
  auVar69 = vsubps_avx(auVar56,auVar174);
  auVar175._0_4_ = (fVar244 + auVar162._0_4_) * 0.33333334;
  auVar175._4_4_ = (fVar157 + auVar162._4_4_) * 0.33333334;
  auVar175._8_4_ = (fVar158 + auVar162._8_4_) * 0.33333334;
  auVar175._12_4_ = (fVar159 + auVar162._12_4_) * 0.33333334;
  auVar59 = vaddps_avx512vl(auVar67,auVar175);
  auVar188._0_4_ = (fVar245 + auVar173._0_4_) * 0.33333334;
  auVar188._4_4_ = (fVar230 + auVar173._4_4_) * 0.33333334;
  auVar188._8_4_ = (fVar240 + auVar173._8_4_) * 0.33333334;
  auVar188._12_4_ = (fVar241 + auVar173._12_4_) * 0.33333334;
  auVar66 = vsubps_avx(auVar57,auVar188);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar54 = vmulps_avx512vl(auVar73,auVar91._0_16_);
  auVar63 = vfmadd213ps_avx512vl(auVar116,auVar72,auVar54);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar71,auVar58);
  auVar60 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar116);
  auVar27._8_4_ = 0x3f000000;
  auVar27._0_8_ = 0x3f0000003f000000;
  auVar27._12_4_ = 0x3f000000;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar72,auVar27);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar71,auVar91._0_16_);
  auVar28._8_4_ = 0x3f000000;
  auVar28._0_8_ = 0x3f0000003f000000;
  auVar28._12_4_ = 0x3f000000;
  auVar61 = vfnmadd231ps_avx512vl(auVar54,auVar70,auVar28);
  auVar54 = vmulps_avx512vl(auVar53,auVar91._0_16_);
  auVar63 = vfmadd213ps_avx512vl(auVar116,auVar76,auVar54);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar75,auVar58);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar74,auVar116);
  auVar29._8_4_ = 0x3f000000;
  auVar29._0_8_ = 0x3f0000003f000000;
  auVar29._12_4_ = 0x3f000000;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar76,auVar29);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar75,auVar91._0_16_);
  auVar30._8_4_ = 0x3f000000;
  auVar30._0_8_ = 0x3f0000003f000000;
  auVar30._12_4_ = 0x3f000000;
  auVar62 = vfnmadd231ps_avx512vl(auVar54,auVar74,auVar30);
  auVar54 = vmulps_avx512vl(auVar73,auVar116);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar72,auVar58);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar116);
  auVar64 = vfmadd231ps_avx512vl(auVar54,auVar70,auVar91._0_16_);
  auVar31._8_4_ = 0x3f000000;
  auVar31._0_8_ = 0x3f0000003f000000;
  auVar31._12_4_ = 0x3f000000;
  auVar54 = vmulps_avx512vl(auVar73,auVar31);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar72);
  auVar32._8_4_ = 0x3f000000;
  auVar32._0_8_ = 0x3f0000003f000000;
  auVar32._12_4_ = 0x3f000000;
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar71,auVar32);
  auVar70 = vfnmadd231ps_avx512vl(auVar54,auVar91._0_16_,auVar70);
  auVar54 = vmulps_avx512vl(auVar53,auVar116);
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar76,auVar58);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar285 = ZEXT1664(auVar71);
  auVar54 = vfmadd231ps_fma(auVar54,auVar75,auVar116);
  auVar72 = vfmadd231ps_avx512vl(auVar54,auVar74,auVar91._0_16_);
  auVar53 = vmulps_avx512vl(auVar53,auVar71);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar91._0_16_,auVar76);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar71,auVar75);
  auVar71 = vfnmadd231ps_avx512vl(auVar53,auVar91._0_16_,auVar74);
  auVar53 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar54 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  fVar230 = auVar61._0_4_;
  auVar269._0_4_ = fVar230 * auVar54._0_4_;
  fVar240 = auVar61._4_4_;
  auVar269._4_4_ = fVar240 * auVar54._4_4_;
  fVar241 = auVar61._8_4_;
  auVar269._8_4_ = fVar241 * auVar54._8_4_;
  fVar242 = auVar61._12_4_;
  auVar269._12_4_ = fVar242 * auVar54._12_4_;
  auVar54 = vfmsub231ps_avx512vl(auVar269,auVar53,auVar63);
  auVar63 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar276._0_4_ = fVar230 * auVar54._0_4_;
  auVar276._4_4_ = fVar240 * auVar54._4_4_;
  auVar276._8_4_ = fVar241 * auVar54._8_4_;
  auVar276._12_4_ = fVar242 * auVar54._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar276,auVar53,auVar62);
  auVar62 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar54 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar53 = vshufps_avx512vl(auVar72,auVar72,0xc9);
  auVar53 = vmulps_avx512vl(auVar70,auVar53);
  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar54,auVar72);
  auVar72 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar73 = vshufps_avx512vl(auVar71,auVar71,0xc9);
  auVar53 = vdpps_avx(auVar63,auVar63,0x7f);
  auVar73 = vmulps_avx512vl(auVar70,auVar73);
  auVar54 = vfmsub231ps_avx512vl(auVar73,auVar54,auVar71);
  auVar71 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar78._16_16_ = auVar95._16_16_;
  auVar78._0_16_ = auVar91._0_16_;
  auVar79._4_28_ = auVar78._4_28_;
  auVar79._0_4_ = auVar53._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar79._0_16_);
  auVar73 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar74 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar74 = vmulss_avx512f(auVar74,auVar54);
  auVar54 = vmulss_avx512f(auVar54,auVar54);
  auVar54 = vmulss_avx512f(auVar74,auVar54);
  auVar54 = vaddss_avx512f(auVar73,auVar54);
  auVar73 = vbroadcastss_avx512vl(auVar54);
  auVar74 = vmulps_avx512vl(auVar63,auVar73);
  auVar54 = vdpps_avx(auVar63,auVar62,0x7f);
  auVar75 = vbroadcastss_avx512vl(auVar53);
  auVar62 = vmulps_avx512vl(auVar75,auVar62);
  fVar110 = auVar54._0_4_;
  auVar176._0_4_ = auVar63._0_4_ * fVar110;
  auVar176._4_4_ = auVar63._4_4_ * fVar110;
  auVar176._8_4_ = auVar63._8_4_ * fVar110;
  auVar176._12_4_ = auVar63._12_4_ * fVar110;
  auVar54 = vsubps_avx(auVar62,auVar176);
  auVar63 = vrcp14ss_avx512f(auVar91._0_16_,auVar79._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar63,ZEXT416(0x40000000));
  fVar110 = auVar63._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar72,auVar72,0x7f);
  auVar117._0_4_ = fVar110 * auVar54._0_4_;
  auVar117._4_4_ = fVar110 * auVar54._4_4_;
  auVar117._8_4_ = fVar110 * auVar54._8_4_;
  auVar117._12_4_ = fVar110 * auVar54._12_4_;
  auVar63 = vmulps_avx512vl(auVar73,auVar117);
  auVar81._16_16_ = auVar95._16_16_;
  auVar81._0_16_ = auVar91._0_16_;
  auVar80._4_28_ = auVar81._4_28_;
  auVar80._0_4_ = auVar53._0_4_;
  auVar54 = vrsqrt14ss_avx512f(auVar91._0_16_,auVar80._0_16_);
  auVar62 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar283 = ZEXT464(0x3f800000);
  auVar73 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar73 = vmulss_avx512f(auVar73,auVar54);
  auVar54 = vmulss_avx512f(auVar73,ZEXT416((uint)(auVar54._0_4_ * auVar54._0_4_)));
  fVar110 = auVar62._0_4_ + auVar54._0_4_;
  auVar277._0_4_ = auVar72._0_4_ * fVar110;
  auVar277._4_4_ = auVar72._4_4_ * fVar110;
  auVar277._8_4_ = auVar72._8_4_ * fVar110;
  auVar277._12_4_ = auVar72._12_4_ * fVar110;
  auVar54 = vdpps_avx(auVar72,auVar71,0x7f);
  auVar62 = vbroadcastss_avx512vl(auVar53);
  auVar62 = vmulps_avx512vl(auVar62,auVar71);
  fVar245 = auVar54._0_4_;
  auVar189._0_4_ = auVar72._0_4_ * fVar245;
  auVar189._4_4_ = auVar72._4_4_ * fVar245;
  auVar189._8_4_ = auVar72._8_4_ * fVar245;
  auVar189._12_4_ = auVar72._12_4_ * fVar245;
  auVar54 = vsubps_avx(auVar62,auVar189);
  auVar62 = vrcp14ss_avx512f(auVar91._0_16_,auVar80._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar62,ZEXT416(0x40000000));
  fVar245 = auVar53._0_4_ * auVar62._0_4_;
  auVar62 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar71 = vmulps_avx512vl(auVar62,auVar74);
  auVar72 = vsubps_avx512vl(auVar60,auVar71);
  auVar53 = vshufps_avx(auVar61,auVar61,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar74);
  auVar118._0_4_ = auVar53._0_4_ + auVar62._0_4_ * auVar63._0_4_;
  auVar118._4_4_ = auVar53._4_4_ + auVar62._4_4_ * auVar63._4_4_;
  auVar118._8_4_ = auVar53._8_4_ + auVar62._8_4_ * auVar63._8_4_;
  auVar118._12_4_ = auVar53._12_4_ + auVar62._12_4_ * auVar63._12_4_;
  auVar53 = vsubps_avx(auVar61,auVar118);
  auVar63 = vaddps_avx512vl(auVar60,auVar71);
  auVar62 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar253._0_4_ = auVar62._0_4_ * auVar277._0_4_;
  auVar253._4_4_ = auVar62._4_4_ * auVar277._4_4_;
  auVar253._8_4_ = auVar62._8_4_ * auVar277._8_4_;
  auVar253._12_4_ = auVar62._12_4_ * auVar277._12_4_;
  auVar71 = vsubps_avx512vl(auVar64,auVar253);
  auVar73 = vshufps_avx512vl(auVar70,auVar70,0xff);
  auVar73 = vmulps_avx512vl(auVar73,auVar277);
  auVar177._0_4_ = auVar73._0_4_ + auVar62._0_4_ * fVar110 * auVar54._0_4_ * fVar245;
  auVar177._4_4_ = auVar73._4_4_ + auVar62._4_4_ * fVar110 * auVar54._4_4_ * fVar245;
  auVar177._8_4_ = auVar73._8_4_ + auVar62._8_4_ * fVar110 * auVar54._8_4_ * fVar245;
  auVar177._12_4_ = auVar73._12_4_ + auVar62._12_4_ * fVar110 * auVar54._12_4_ * fVar245;
  auVar54 = vsubps_avx(auVar70,auVar177);
  auVar62 = vaddps_avx512vl(auVar64,auVar253);
  auVar190._0_4_ = auVar72._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar190._4_4_ = auVar72._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar190._8_4_ = auVar72._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar190._12_4_ = auVar72._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar223._0_4_ = auVar54._0_4_ * 0.33333334;
  auVar223._4_4_ = auVar54._4_4_ * 0.33333334;
  auVar223._8_4_ = auVar54._8_4_ * 0.33333334;
  auVar223._12_4_ = auVar54._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar71,auVar223);
  auVar119._0_4_ = auVar63._0_4_ + (fVar230 + auVar118._0_4_) * 0.33333334;
  auVar119._4_4_ = auVar63._4_4_ + (fVar240 + auVar118._4_4_) * 0.33333334;
  auVar119._8_4_ = auVar63._8_4_ + (fVar241 + auVar118._8_4_) * 0.33333334;
  auVar119._12_4_ = auVar63._12_4_ + (fVar242 + auVar118._12_4_) * 0.33333334;
  auVar178._0_4_ = (auVar70._0_4_ + auVar177._0_4_) * 0.33333334;
  auVar178._4_4_ = (auVar70._4_4_ + auVar177._4_4_) * 0.33333334;
  auVar178._8_4_ = (auVar70._8_4_ + auVar177._8_4_) * 0.33333334;
  auVar178._12_4_ = (auVar70._12_4_ + auVar177._12_4_) * 0.33333334;
  auVar54 = vsubps_avx(auVar62,auVar178);
  auVar70 = vbroadcastss_avx512vl(auVar55);
  auVar73 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
  auVar278._0_4_ = auVar73._0_4_;
  auVar278._4_4_ = auVar278._0_4_;
  auVar278._8_4_ = auVar278._0_4_;
  auVar278._12_4_ = auVar278._0_4_;
  auVar72 = vmulps_avx512vl(auVar70,auVar72);
  auVar73 = vmulps_avx512vl(auVar70,auVar190);
  auVar53 = vmulps_avx512vl(auVar70,auVar53);
  auVar270._0_4_ = auVar70._0_4_ * auVar71._0_4_;
  auVar270._4_4_ = auVar70._4_4_ * auVar71._4_4_;
  auVar270._8_4_ = auVar70._8_4_ * auVar71._8_4_;
  auVar270._12_4_ = auVar70._12_4_ * auVar71._12_4_;
  local_208 = vfmadd231ps_avx512vl(auVar72,auVar278,auVar68);
  local_218 = vfmadd231ps_avx512vl(auVar73,auVar278,auVar198);
  local_228 = vfmadd231ps_avx512vl(auVar53,auVar278,auVar69);
  local_238 = vfmadd231ps_fma(auVar270,auVar278,auVar56);
  auVar53 = vmulps_avx512vl(auVar70,auVar63);
  auVar63 = vmulps_avx512vl(auVar70,auVar119);
  auVar54 = vmulps_avx512vl(auVar70,auVar54);
  auVar263._0_4_ = auVar70._0_4_ * auVar62._0_4_;
  auVar263._4_4_ = auVar70._4_4_ * auVar62._4_4_;
  auVar263._8_4_ = auVar70._8_4_ * auVar62._8_4_;
  auVar263._12_4_ = auVar70._12_4_ * auVar62._12_4_;
  _local_248 = vfmadd231ps_avx512vl(auVar53,auVar278,auVar67);
  _local_258 = vfmadd231ps_avx512vl(auVar63,auVar278,auVar59);
  _local_268 = vfmadd231ps_avx512vl(auVar54,auVar278,auVar66);
  _local_278 = vfmadd231ps_fma(auVar263,auVar278,auVar57);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_188 = vsubps_avx512vl(local_208,auVar53);
  uVar111 = local_188._0_4_;
  auVar120._4_4_ = uVar111;
  auVar120._0_4_ = uVar111;
  auVar120._8_4_ = uVar111;
  auVar120._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_188,local_188,0x55);
  auVar63 = vshufps_avx(local_188,local_188,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar110 = pre->ray_space[k].vz.field_0.m128[0];
  fVar245 = pre->ray_space[k].vz.field_0.m128[1];
  fVar230 = pre->ray_space[k].vz.field_0.m128[2];
  fVar240 = pre->ray_space[k].vz.field_0.m128[3];
  auVar114._0_4_ = fVar110 * auVar63._0_4_;
  auVar114._4_4_ = fVar245 * auVar63._4_4_;
  auVar114._8_4_ = fVar230 * auVar63._8_4_;
  auVar114._12_4_ = fVar240 * auVar63._12_4_;
  auVar54 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar54);
  auVar67 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar120);
  local_198 = vsubps_avx512vl(local_218,auVar53);
  uVar111 = local_198._0_4_;
  auVar142._4_4_ = uVar111;
  auVar142._0_4_ = uVar111;
  auVar142._8_4_ = uVar111;
  auVar142._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_198,local_198,0x55);
  auVar63 = vshufps_avx(local_198,local_198,0xaa);
  auVar121._0_4_ = fVar110 * auVar63._0_4_;
  auVar121._4_4_ = fVar245 * auVar63._4_4_;
  auVar121._8_4_ = fVar230 * auVar63._8_4_;
  auVar121._12_4_ = fVar240 * auVar63._12_4_;
  auVar54 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar4,auVar54);
  auVar68 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar142);
  local_1a8 = vsubps_avx512vl(local_228,auVar53);
  uVar111 = local_1a8._0_4_;
  auVar143._4_4_ = uVar111;
  auVar143._0_4_ = uVar111;
  auVar143._8_4_ = uVar111;
  auVar143._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar63 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar210._0_4_ = auVar63._0_4_ * fVar110;
  auVar210._4_4_ = auVar63._4_4_ * fVar245;
  auVar210._8_4_ = auVar63._8_4_ * fVar230;
  auVar210._12_4_ = auVar63._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar4,auVar54);
  auVar70 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar143);
  local_1b8 = vsubps_avx(local_238,auVar53);
  uVar111 = local_1b8._0_4_;
  auVar144._4_4_ = uVar111;
  auVar144._0_4_ = uVar111;
  auVar144._8_4_ = uVar111;
  auVar144._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar63 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar224._0_4_ = auVar63._0_4_ * fVar110;
  auVar224._4_4_ = auVar63._4_4_ * fVar245;
  auVar224._8_4_ = auVar63._8_4_ * fVar230;
  auVar224._12_4_ = auVar63._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar4,auVar54);
  auVar71 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar144);
  local_1c8 = vsubps_avx512vl(_local_248,auVar53);
  uVar111 = local_1c8._0_4_;
  auVar145._4_4_ = uVar111;
  auVar145._0_4_ = uVar111;
  auVar145._8_4_ = uVar111;
  auVar145._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar63 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar231._0_4_ = auVar63._0_4_ * fVar110;
  auVar231._4_4_ = auVar63._4_4_ * fVar245;
  auVar231._8_4_ = auVar63._8_4_ * fVar230;
  auVar231._12_4_ = auVar63._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar4,auVar54);
  auVar72 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar145);
  local_1d8 = vsubps_avx512vl(_local_258,auVar53);
  uVar111 = local_1d8._0_4_;
  auVar146._4_4_ = uVar111;
  auVar146._0_4_ = uVar111;
  auVar146._8_4_ = uVar111;
  auVar146._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar63 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar246._0_4_ = auVar63._0_4_ * fVar110;
  auVar246._4_4_ = auVar63._4_4_ * fVar245;
  auVar246._8_4_ = auVar63._8_4_ * fVar230;
  auVar246._12_4_ = auVar63._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar4,auVar54);
  auVar73 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar146);
  local_1e8 = vsubps_avx512vl(_local_268,auVar53);
  uVar111 = local_1e8._0_4_;
  auVar147._4_4_ = uVar111;
  auVar147._0_4_ = uVar111;
  auVar147._8_4_ = uVar111;
  auVar147._12_4_ = uVar111;
  auVar54 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar63 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar254._0_4_ = auVar63._0_4_ * fVar110;
  auVar254._4_4_ = auVar63._4_4_ * fVar245;
  auVar254._8_4_ = auVar63._8_4_ * fVar230;
  auVar254._12_4_ = auVar63._12_4_ * fVar240;
  auVar54 = vfmadd231ps_fma(auVar254,(undefined1  [16])aVar4,auVar54);
  auVar74 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar147);
  local_1f8 = vsubps_avx(_local_278,auVar53);
  uVar111 = local_1f8._0_4_;
  auVar131._4_4_ = uVar111;
  auVar131._0_4_ = uVar111;
  auVar131._8_4_ = uVar111;
  auVar131._12_4_ = uVar111;
  auVar53 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar54 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar191._0_4_ = fVar110 * auVar54._0_4_;
  auVar191._4_4_ = fVar245 * auVar54._4_4_;
  auVar191._8_4_ = fVar230 * auVar54._8_4_;
  auVar191._12_4_ = fVar240 * auVar54._12_4_;
  auVar53 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar4,auVar53);
  auVar75 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar131);
  auVar63 = vmovlhps_avx(auVar67,auVar72);
  auVar62 = vmovlhps_avx(auVar68,auVar73);
  auVar69 = vmovlhps_avx(auVar70,auVar74);
  _local_3c8 = vmovlhps_avx512f(auVar71,auVar75);
  auVar54 = vminps_avx(auVar63,auVar62);
  auVar53 = vmaxps_avx(auVar63,auVar62);
  auVar66 = vminps_avx512vl(auVar69,_local_3c8);
  auVar54 = vminps_avx(auVar54,auVar66);
  auVar66 = vmaxps_avx512vl(auVar69,_local_3c8);
  auVar53 = vmaxps_avx(auVar53,auVar66);
  auVar66 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vminps_avx(auVar54,auVar66);
  auVar66 = vshufpd_avx(auVar53,auVar53,3);
  auVar53 = vmaxps_avx(auVar53,auVar66);
  auVar54 = vandps_avx512vl(auVar54,auVar282._0_16_);
  auVar53 = vandps_avx512vl(auVar53,auVar282._0_16_);
  auVar53 = vmaxps_avx(auVar54,auVar53);
  auVar54 = vmovshdup_avx(auVar53);
  auVar53 = vmaxss_avx(auVar54,auVar53);
  local_348 = vmovddup_avx512vl(auVar67);
  local_358 = vmovddup_avx512vl(auVar68);
  local_368._0_8_ = auVar70._0_8_;
  local_368._8_8_ = local_368._0_8_;
  local_378._0_8_ = auVar71._0_8_;
  local_378._8_8_ = local_378._0_8_;
  register0x000012c8 = auVar72._0_8_;
  local_388 = auVar72._0_8_;
  register0x00001308 = auVar73._0_8_;
  local_398 = auVar73._0_8_;
  register0x00001488 = auVar74._0_8_;
  local_3a8 = auVar74._0_8_;
  local_3b8 = auVar75._0_8_;
  register0x00001388 = local_3b8;
  local_3d8 = ZEXT416((uint)(auVar53._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_3d8);
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  auVar53 = vxorps_avx512vl(local_78._0_16_,auVar33);
  local_98 = vbroadcastss_avx512vl(auVar53);
  bVar49 = false;
  uVar45 = 0;
  fVar110 = *(float *)(ray + k * 4 + 0x30);
  local_158 = vsubps_avx(auVar62,auVar63);
  local_168 = vsubps_avx(auVar69,auVar62);
  local_178 = vsubps_avx512vl(_local_3c8,auVar69);
  local_2a8 = vsubps_avx512vl(_local_248,local_208);
  local_2b8 = vsubps_avx512vl(_local_258,local_218);
  local_2c8 = vsubps_avx512vl(_local_268,local_228);
  _local_2d8 = vsubps_avx(_local_278,local_238);
  local_2e8 = vpbroadcastd_avx512vl();
  auVar53 = ZEXT816(0x3f80000000000000);
  auVar280 = ZEXT1664(auVar53);
  do {
    auVar284 = ZEXT3264(local_98);
    auVar73 = auVar280._0_16_;
    auVar54 = vshufps_avx(auVar73,auVar73,0x50);
    auVar264._8_4_ = 0x3f800000;
    auVar264._0_8_ = &DAT_3f8000003f800000;
    auVar264._12_4_ = 0x3f800000;
    auVar267._16_4_ = 0x3f800000;
    auVar267._0_16_ = auVar264;
    auVar267._20_4_ = 0x3f800000;
    auVar267._24_4_ = 0x3f800000;
    auVar267._28_4_ = 0x3f800000;
    auVar66 = vsubps_avx(auVar264,auVar54);
    fVar245 = auVar54._0_4_;
    auVar148._0_4_ = local_388._0_4_ * fVar245;
    fVar230 = auVar54._4_4_;
    auVar148._4_4_ = local_388._4_4_ * fVar230;
    fVar240 = auVar54._8_4_;
    auVar148._8_4_ = local_388._8_4_ * fVar240;
    fVar241 = auVar54._12_4_;
    auVar148._12_4_ = local_388._12_4_ * fVar241;
    auVar163._0_4_ = local_398._0_4_ * fVar245;
    auVar163._4_4_ = local_398._4_4_ * fVar230;
    auVar163._8_4_ = local_398._8_4_ * fVar240;
    auVar163._12_4_ = local_398._12_4_ * fVar241;
    auVar179._0_4_ = local_3a8._0_4_ * fVar245;
    auVar179._4_4_ = local_3a8._4_4_ * fVar230;
    auVar179._8_4_ = local_3a8._8_4_ * fVar240;
    auVar179._12_4_ = local_3a8._12_4_ * fVar241;
    auVar122._0_4_ = local_3b8._0_4_ * fVar245;
    auVar122._4_4_ = local_3b8._4_4_ * fVar230;
    auVar122._8_4_ = local_3b8._8_4_ * fVar240;
    auVar122._12_4_ = local_3b8._12_4_ * fVar241;
    auVar68 = vfmadd231ps_avx512vl(auVar148,auVar66,local_348);
    auVar70 = vfmadd231ps_avx512vl(auVar163,auVar66,local_358);
    auVar67 = vfmadd231ps_fma(auVar179,auVar66,local_368);
    auVar66 = vfmadd231ps_fma(auVar122,local_378,auVar66);
    auVar54 = vmovshdup_avx(auVar53);
    fVar230 = auVar53._0_4_;
    fVar245 = (auVar54._0_4_ - fVar230) * 0.04761905;
    auVar154._4_4_ = fVar230;
    auVar154._0_4_ = fVar230;
    auVar154._8_4_ = fVar230;
    auVar154._12_4_ = fVar230;
    auVar154._16_4_ = fVar230;
    auVar154._20_4_ = fVar230;
    auVar154._24_4_ = fVar230;
    auVar154._28_4_ = fVar230;
    auVar87._0_8_ = auVar54._0_8_;
    auVar87._8_8_ = auVar87._0_8_;
    auVar87._16_8_ = auVar87._0_8_;
    auVar87._24_8_ = auVar87._0_8_;
    auVar95 = vsubps_avx(auVar87,auVar154);
    uVar111 = auVar68._0_4_;
    auVar97._4_4_ = uVar111;
    auVar97._0_4_ = uVar111;
    auVar97._8_4_ = uVar111;
    auVar97._12_4_ = uVar111;
    auVar97._16_4_ = uVar111;
    auVar97._20_4_ = uVar111;
    auVar97._24_4_ = uVar111;
    auVar97._28_4_ = uVar111;
    auVar89._8_4_ = 1;
    auVar89._0_8_ = 0x100000001;
    auVar89._12_4_ = 1;
    auVar89._16_4_ = 1;
    auVar89._20_4_ = 1;
    auVar89._24_4_ = 1;
    auVar89._28_4_ = 1;
    auVar93 = ZEXT1632(auVar68);
    auVar91 = vpermps_avx2(auVar89,auVar93);
    auVar77 = vbroadcastss_avx512vl(auVar70);
    auVar94 = ZEXT1632(auVar70);
    auVar78 = vpermps_avx512vl(auVar89,auVar94);
    auVar79 = vbroadcastss_avx512vl(auVar67);
    auVar92 = ZEXT1632(auVar67);
    auVar80 = vpermps_avx512vl(auVar89,auVar92);
    auVar81 = vbroadcastss_avx512vl(auVar66);
    auVar90 = ZEXT1632(auVar66);
    auVar82 = vpermps_avx512vl(auVar89,auVar90);
    auVar228._4_4_ = fVar245;
    auVar228._0_4_ = fVar245;
    auVar228._8_4_ = fVar245;
    auVar228._12_4_ = fVar245;
    auVar228._16_4_ = fVar245;
    auVar228._20_4_ = fVar245;
    auVar228._24_4_ = fVar245;
    auVar228._28_4_ = fVar245;
    auVar88._8_4_ = 2;
    auVar88._0_8_ = 0x200000002;
    auVar88._12_4_ = 2;
    auVar88._16_4_ = 2;
    auVar88._20_4_ = 2;
    auVar88._24_4_ = 2;
    auVar88._28_4_ = 2;
    auVar83 = vpermps_avx512vl(auVar88,auVar93);
    auVar84 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar85 = vpermps_avx512vl(auVar84,auVar93);
    auVar93 = vpermps_avx2(auVar88,auVar94);
    auVar86 = vpermps_avx512vl(auVar84,auVar94);
    auVar94 = vpermps_avx2(auVar88,auVar92);
    auVar87 = vpermps_avx512vl(auVar84,auVar92);
    auVar88 = vpermps_avx512vl(auVar88,auVar90);
    auVar89 = vpermps_avx512vl(auVar84,auVar90);
    auVar54 = vfmadd132ps_fma(auVar95,auVar154,_DAT_02020f20);
    auVar95 = vsubps_avx(auVar267,ZEXT1632(auVar54));
    auVar84 = vmulps_avx512vl(auVar77,ZEXT1632(auVar54));
    auVar92 = ZEXT1632(auVar54);
    auVar90 = vmulps_avx512vl(auVar78,auVar92);
    auVar66 = vfmadd231ps_fma(auVar84,auVar95,auVar97);
    auVar67 = vfmadd231ps_fma(auVar90,auVar95,auVar91);
    auVar84 = vmulps_avx512vl(auVar79,auVar92);
    auVar90 = vmulps_avx512vl(auVar80,auVar92);
    auVar77 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar78);
    auVar84 = vmulps_avx512vl(auVar81,auVar92);
    auVar97 = ZEXT1632(auVar54);
    auVar82 = vmulps_avx512vl(auVar82,auVar97);
    auVar79 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar80);
    fVar240 = auVar54._0_4_;
    fVar241 = auVar54._4_4_;
    auVar82._4_4_ = fVar241 * auVar77._4_4_;
    auVar82._0_4_ = fVar240 * auVar77._0_4_;
    fVar242 = auVar54._8_4_;
    auVar82._8_4_ = fVar242 * auVar77._8_4_;
    fVar243 = auVar54._12_4_;
    auVar82._12_4_ = fVar243 * auVar77._12_4_;
    auVar82._16_4_ = auVar77._16_4_ * 0.0;
    auVar82._20_4_ = auVar77._20_4_ * 0.0;
    auVar82._24_4_ = auVar77._24_4_ * 0.0;
    auVar82._28_4_ = fVar230;
    auVar84._4_4_ = fVar241 * auVar78._4_4_;
    auVar84._0_4_ = fVar240 * auVar78._0_4_;
    auVar84._8_4_ = fVar242 * auVar78._8_4_;
    auVar84._12_4_ = fVar243 * auVar78._12_4_;
    auVar84._16_4_ = auVar78._16_4_ * 0.0;
    auVar84._20_4_ = auVar78._20_4_ * 0.0;
    auVar84._24_4_ = auVar78._24_4_ * 0.0;
    auVar84._28_4_ = auVar91._28_4_;
    auVar66 = vfmadd231ps_fma(auVar82,auVar95,ZEXT1632(auVar66));
    auVar67 = vfmadd231ps_fma(auVar84,auVar95,ZEXT1632(auVar67));
    auVar96._0_4_ = fVar240 * auVar79._0_4_;
    auVar96._4_4_ = fVar241 * auVar79._4_4_;
    auVar96._8_4_ = fVar242 * auVar79._8_4_;
    auVar96._12_4_ = fVar243 * auVar79._12_4_;
    auVar96._16_4_ = auVar79._16_4_ * 0.0;
    auVar96._20_4_ = auVar79._20_4_ * 0.0;
    auVar96._24_4_ = auVar79._24_4_ * 0.0;
    auVar96._28_4_ = 0;
    auVar90._4_4_ = fVar241 * auVar80._4_4_;
    auVar90._0_4_ = fVar240 * auVar80._0_4_;
    auVar90._8_4_ = fVar242 * auVar80._8_4_;
    auVar90._12_4_ = fVar243 * auVar80._12_4_;
    auVar90._16_4_ = auVar80._16_4_ * 0.0;
    auVar90._20_4_ = auVar80._20_4_ * 0.0;
    auVar90._24_4_ = auVar80._24_4_ * 0.0;
    auVar90._28_4_ = auVar79._28_4_;
    auVar68 = vfmadd231ps_fma(auVar96,auVar95,auVar77);
    auVar70 = vfmadd231ps_fma(auVar90,auVar95,auVar78);
    auVar92._28_4_ = auVar78._28_4_;
    auVar92._0_28_ =
         ZEXT1628(CONCAT412(fVar243 * auVar70._12_4_,
                            CONCAT48(fVar242 * auVar70._8_4_,
                                     CONCAT44(fVar241 * auVar70._4_4_,fVar240 * auVar70._0_4_))));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar243 * auVar68._12_4_,
                                                 CONCAT48(fVar242 * auVar68._8_4_,
                                                          CONCAT44(fVar241 * auVar68._4_4_,
                                                                   fVar240 * auVar68._0_4_)))),
                              auVar95,ZEXT1632(auVar66));
    auVar72 = vfmadd231ps_fma(auVar92,auVar95,ZEXT1632(auVar67));
    auVar91 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar66));
    auVar77 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar67));
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar91 = vmulps_avx512vl(auVar91,auVar78);
    auVar77 = vmulps_avx512vl(auVar77,auVar78);
    auVar166._0_4_ = fVar245 * auVar91._0_4_;
    auVar166._4_4_ = fVar245 * auVar91._4_4_;
    auVar166._8_4_ = fVar245 * auVar91._8_4_;
    auVar166._12_4_ = fVar245 * auVar91._12_4_;
    auVar166._16_4_ = fVar245 * auVar91._16_4_;
    auVar166._20_4_ = fVar245 * auVar91._20_4_;
    auVar166._24_4_ = fVar245 * auVar91._24_4_;
    auVar166._28_4_ = 0;
    auVar91 = vmulps_avx512vl(auVar228,auVar77);
    auVar68 = vxorps_avx512vl(auVar81._0_16_,auVar81._0_16_);
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_0205fd20,ZEXT1632(auVar68));
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_0205fd20,ZEXT1632(auVar68));
    auVar128._0_4_ = auVar166._0_4_ + auVar71._0_4_;
    auVar128._4_4_ = auVar166._4_4_ + auVar71._4_4_;
    auVar128._8_4_ = auVar166._8_4_ + auVar71._8_4_;
    auVar128._12_4_ = auVar166._12_4_ + auVar71._12_4_;
    auVar128._16_4_ = auVar166._16_4_ + 0.0;
    auVar128._20_4_ = auVar166._20_4_ + 0.0;
    auVar128._24_4_ = auVar166._24_4_ + 0.0;
    auVar128._28_4_ = 0;
    auVar96 = ZEXT1632(auVar68);
    auVar80 = vpermt2ps_avx512vl(auVar166,_DAT_0205fd20,auVar96);
    auVar81 = vaddps_avx512vl(ZEXT1632(auVar72),auVar91);
    auVar82 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar96);
    auVar91 = vsubps_avx(auVar77,auVar80);
    auVar80 = vsubps_avx512vl(auVar79,auVar82);
    auVar82 = vmulps_avx512vl(auVar93,auVar97);
    auVar84 = vmulps_avx512vl(auVar86,auVar97);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar85);
    auVar90 = vmulps_avx512vl(auVar94,auVar97);
    auVar92 = vmulps_avx512vl(auVar87,auVar97);
    auVar93 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar93);
    auVar90 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar86);
    auVar92 = vmulps_avx512vl(auVar88,auVar97);
    auVar83 = vmulps_avx512vl(auVar89,auVar97);
    auVar66 = vfmadd231ps_fma(auVar92,auVar95,auVar94);
    auVar67 = vfmadd231ps_fma(auVar83,auVar95,auVar87);
    auVar92 = vmulps_avx512vl(auVar97,auVar93);
    auVar83 = vmulps_avx512vl(ZEXT1632(auVar54),auVar90);
    auVar82 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar82);
    auVar84 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar84);
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar243 * auVar66._12_4_,
                                            CONCAT48(fVar242 * auVar66._8_4_,
                                                     CONCAT44(fVar241 * auVar66._4_4_,
                                                              fVar240 * auVar66._0_4_)))),auVar95,
                         auVar93);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar243 * auVar67._12_4_,
                                            CONCAT48(fVar242 * auVar67._8_4_,
                                                     CONCAT44(fVar241 * auVar67._4_4_,
                                                              fVar240 * auVar67._0_4_)))),auVar95,
                         auVar90);
    auVar83._4_4_ = fVar241 * auVar93._4_4_;
    auVar83._0_4_ = fVar240 * auVar93._0_4_;
    auVar83._8_4_ = fVar242 * auVar93._8_4_;
    auVar83._12_4_ = fVar243 * auVar93._12_4_;
    auVar83._16_4_ = auVar93._16_4_ * 0.0;
    auVar83._20_4_ = auVar93._20_4_ * 0.0;
    auVar83._24_4_ = auVar93._24_4_ * 0.0;
    auVar83._28_4_ = auVar87._28_4_;
    auVar85._4_4_ = fVar241 * auVar90._4_4_;
    auVar85._0_4_ = fVar240 * auVar90._0_4_;
    auVar85._8_4_ = fVar242 * auVar90._8_4_;
    auVar85._12_4_ = fVar243 * auVar90._12_4_;
    auVar85._16_4_ = auVar90._16_4_ * 0.0;
    auVar85._20_4_ = auVar90._20_4_ * 0.0;
    auVar85._24_4_ = auVar90._24_4_ * 0.0;
    auVar85._28_4_ = auVar94._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar83,auVar95,auVar82);
    auVar92 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar95);
    auVar95 = vsubps_avx512vl(auVar93,auVar82);
    auVar93 = vsubps_avx512vl(auVar90,auVar84);
    auVar95 = vmulps_avx512vl(auVar95,auVar78);
    auVar93 = vmulps_avx512vl(auVar93,auVar78);
    fVar230 = fVar245 * auVar95._0_4_;
    fVar240 = fVar245 * auVar95._4_4_;
    auVar86._4_4_ = fVar240;
    auVar86._0_4_ = fVar230;
    fVar241 = fVar245 * auVar95._8_4_;
    auVar86._8_4_ = fVar241;
    fVar242 = fVar245 * auVar95._12_4_;
    auVar86._12_4_ = fVar242;
    fVar243 = fVar245 * auVar95._16_4_;
    auVar86._16_4_ = fVar243;
    fVar244 = fVar245 * auVar95._20_4_;
    auVar86._20_4_ = fVar244;
    fVar245 = fVar245 * auVar95._24_4_;
    auVar86._24_4_ = fVar245;
    auVar86._28_4_ = auVar95._28_4_;
    auVar93 = vmulps_avx512vl(auVar228,auVar93);
    auVar78 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar96);
    auVar82 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,auVar96);
    auVar229._0_4_ = auVar94._0_4_ + fVar230;
    auVar229._4_4_ = auVar94._4_4_ + fVar240;
    auVar229._8_4_ = auVar94._8_4_ + fVar241;
    auVar229._12_4_ = auVar94._12_4_ + fVar242;
    auVar229._16_4_ = auVar94._16_4_ + fVar243;
    auVar229._20_4_ = auVar94._20_4_ + fVar244;
    auVar229._24_4_ = auVar94._24_4_ + fVar245;
    auVar229._28_4_ = auVar94._28_4_ + auVar95._28_4_;
    auVar95 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,ZEXT1632(auVar68));
    auVar84 = vaddps_avx512vl(auVar92,auVar93);
    auVar93 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,ZEXT1632(auVar68));
    auVar95 = vsubps_avx(auVar78,auVar95);
    auVar93 = vsubps_avx512vl(auVar82,auVar93);
    auVar154 = ZEXT1632(auVar71);
    auVar90 = vsubps_avx512vl(auVar94,auVar154);
    auVar166 = ZEXT1632(auVar72);
    auVar83 = vsubps_avx512vl(auVar92,auVar166);
    auVar85 = vsubps_avx512vl(auVar78,auVar77);
    auVar90 = vaddps_avx512vl(auVar90,auVar85);
    auVar85 = vsubps_avx512vl(auVar82,auVar79);
    auVar83 = vaddps_avx512vl(auVar83,auVar85);
    auVar85 = vmulps_avx512vl(auVar166,auVar90);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar154,auVar83);
    auVar86 = vmulps_avx512vl(auVar81,auVar90);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar128,auVar83);
    auVar87 = vmulps_avx512vl(auVar80,auVar90);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar91,auVar83);
    auVar88 = vmulps_avx512vl(auVar79,auVar90);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar77,auVar83);
    auVar89 = vmulps_avx512vl(auVar92,auVar90);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar94,auVar83);
    auVar96 = vmulps_avx512vl(auVar84,auVar90);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar229,auVar83);
    auVar97 = vmulps_avx512vl(auVar93,auVar90);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar95,auVar83);
    auVar90 = vmulps_avx512vl(auVar82,auVar90);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar78,auVar83);
    auVar83 = vminps_avx512vl(auVar85,auVar86);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar87,auVar88);
    auVar83 = vminps_avx512vl(auVar83,auVar86);
    auVar86 = vmaxps_avx512vl(auVar87,auVar88);
    auVar85 = vmaxps_avx512vl(auVar85,auVar86);
    auVar86 = vminps_avx512vl(auVar89,auVar96);
    auVar87 = vmaxps_avx512vl(auVar89,auVar96);
    auVar88 = vminps_avx512vl(auVar97,auVar90);
    auVar86 = vminps_avx512vl(auVar86,auVar88);
    auVar83 = vminps_avx512vl(auVar83,auVar86);
    auVar90 = vmaxps_avx512vl(auVar97,auVar90);
    auVar90 = vmaxps_avx512vl(auVar87,auVar90);
    auVar90 = vmaxps_avx512vl(auVar85,auVar90);
    uVar16 = vcmpps_avx512vl(auVar83,local_78,2);
    uVar17 = vcmpps_avx512vl(auVar90,local_98,5);
    uVar48 = 0;
    bVar40 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    if (bVar40 != 0) {
      auVar90 = vsubps_avx512vl(auVar77,auVar154);
      auVar83 = vsubps_avx512vl(auVar79,auVar166);
      auVar85 = vsubps_avx512vl(auVar78,auVar94);
      auVar90 = vaddps_avx512vl(auVar90,auVar85);
      auVar85 = vsubps_avx512vl(auVar82,auVar92);
      auVar83 = vaddps_avx512vl(auVar83,auVar85);
      auVar85 = vmulps_avx512vl(auVar166,auVar90);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar83,auVar154);
      auVar81 = vmulps_avx512vl(auVar81,auVar90);
      auVar81 = vfnmadd213ps_avx512vl(auVar128,auVar83,auVar81);
      auVar80 = vmulps_avx512vl(auVar80,auVar90);
      auVar80 = vfnmadd213ps_avx512vl(auVar91,auVar83,auVar80);
      auVar91 = vmulps_avx512vl(auVar79,auVar90);
      auVar79 = vfnmadd231ps_avx512vl(auVar91,auVar83,auVar77);
      auVar91 = vmulps_avx512vl(auVar92,auVar90);
      auVar94 = vfnmadd231ps_avx512vl(auVar91,auVar83,auVar94);
      auVar91 = vmulps_avx512vl(auVar84,auVar90);
      auVar84 = vfnmadd213ps_avx512vl(auVar229,auVar83,auVar91);
      auVar91 = vmulps_avx512vl(auVar93,auVar90);
      auVar92 = vfnmadd213ps_avx512vl(auVar95,auVar83,auVar91);
      auVar95 = vmulps_avx512vl(auVar82,auVar90);
      auVar78 = vfnmadd231ps_avx512vl(auVar95,auVar78,auVar83);
      auVar91 = vminps_avx(auVar85,auVar81);
      auVar95 = vmaxps_avx(auVar85,auVar81);
      auVar77 = vminps_avx(auVar80,auVar79);
      auVar77 = vminps_avx(auVar91,auVar77);
      auVar91 = vmaxps_avx(auVar80,auVar79);
      auVar95 = vmaxps_avx(auVar95,auVar91);
      auVar93 = vminps_avx(auVar94,auVar84);
      auVar91 = vmaxps_avx(auVar94,auVar84);
      auVar94 = vminps_avx(auVar92,auVar78);
      auVar93 = vminps_avx(auVar93,auVar94);
      auVar93 = vminps_avx(auVar77,auVar93);
      auVar77 = vmaxps_avx(auVar92,auVar78);
      auVar91 = vmaxps_avx(auVar91,auVar77);
      auVar95 = vmaxps_avx(auVar95,auVar91);
      uVar16 = vcmpps_avx512vl(auVar95,local_98,5);
      uVar17 = vcmpps_avx512vl(auVar93,local_78,2);
      uVar48 = (uint)(bVar40 & (byte)uVar16 & (byte)uVar17);
    }
    if (uVar48 != 0) {
      auStack_338[uVar45] = uVar48;
      uVar16 = vmovlps_avx(auVar53);
      *(undefined8 *)(&uStack_148 + uVar45 * 2) = uVar16;
      uVar52 = vmovlps_avx(auVar73);
      auStack_58[uVar45] = uVar52;
      uVar45 = (ulong)((int)uVar45 + 1);
    }
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar281 = ZEXT3264(auVar95);
    do {
      in_ZMM24 = ZEXT464(0xb8d1b717);
      auVar66 = auVar287._0_16_;
      auVar53 = in_ZMM24._0_16_;
      auVar54 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar45 == 0) {
        if (bVar49) {
          return local_489;
        }
        uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar111;
        auVar37._0_4_ = uVar111;
        auVar37._8_4_ = uVar111;
        auVar37._12_4_ = uVar111;
        uVar16 = vcmpps_avx512vl(local_288,auVar37,2);
        uVar48 = (uint)uVar51 & (uint)uVar51 + 0xf & (uint)uVar16;
        uVar51 = (ulong)uVar48;
        local_489 = uVar48 != 0;
        if (!local_489) {
          return local_489;
        }
        goto LAB_01c5bd1d;
      }
      uVar41 = (int)uVar45 - 1;
      uVar43 = (ulong)uVar41;
      uVar48 = (&uStack_148)[uVar43 * 2];
      fVar245 = afStack_144[uVar43 * 2];
      uVar6 = auStack_338[uVar43];
      auVar279._8_8_ = 0;
      auVar279._0_8_ = auStack_58[uVar43];
      auVar280 = ZEXT1664(auVar279);
      lVar46 = 0;
      for (uVar52 = (ulong)uVar6; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        lVar46 = lVar46 + 1;
      }
      uVar44 = uVar6 - 1 & uVar6;
      auStack_338[uVar43] = uVar44;
      if (uVar44 == 0) {
        uVar45 = (ulong)uVar41;
      }
      auVar68 = vpxord_avx512vl(auVar284._0_16_,auVar284._0_16_);
      auVar67 = vcvtsi2ss_avx512f(auVar68,lVar46);
      auVar70 = vmulss_avx512f(auVar67,SUB6416(ZEXT464(0x3e124925),0));
      lVar46 = lVar46 + 1;
      auVar67 = vpxord_avx512vl(auVar68,auVar68);
      auVar67 = vcvtsi2ss_avx512f(auVar67,lVar46);
      auVar67 = vmulss_avx512f(auVar67,SUB6416(ZEXT464(0x3e124925),0));
      auVar71 = auVar283._0_16_;
      auVar68 = vsubss_avx512f(auVar71,auVar70);
      auVar70 = vmulss_avx512f(ZEXT416((uint)fVar245),auVar70);
      auVar68 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar48),auVar68);
      auVar70 = vsubss_avx512f(auVar71,auVar67);
      auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar245 * auVar67._0_4_)),ZEXT416(uVar48),auVar70);
      auVar70 = vsubss_avx512f(auVar67,auVar68);
      vucomiss_avx512f(auVar70);
      if (uVar6 == 0 || lVar46 == 0) break;
      auVar284 = ZEXT1664(auVar279);
      auVar72 = vshufps_avx(auVar279,auVar279,0x50);
      vucomiss_avx512f(auVar70);
      uVar48 = (uint)uVar45;
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = &DAT_3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar73 = vsubps_avx(auVar132,auVar72);
      fVar245 = auVar72._0_4_;
      auVar149._0_4_ = fVar245 * (float)local_388._0_4_;
      fVar230 = auVar72._4_4_;
      auVar149._4_4_ = fVar230 * (float)local_388._4_4_;
      fVar240 = auVar72._8_4_;
      auVar149._8_4_ = fVar240 * fStack_380;
      fVar241 = auVar72._12_4_;
      auVar149._12_4_ = fVar241 * fStack_37c;
      auVar164._0_4_ = fVar245 * (float)local_398._0_4_;
      auVar164._4_4_ = fVar230 * (float)local_398._4_4_;
      auVar164._8_4_ = fVar240 * fStack_390;
      auVar164._12_4_ = fVar241 * fStack_38c;
      auVar180._0_4_ = fVar245 * (float)local_3a8._0_4_;
      auVar180._4_4_ = fVar230 * (float)local_3a8._4_4_;
      auVar180._8_4_ = fVar240 * fStack_3a0;
      auVar180._12_4_ = fVar241 * fStack_39c;
      auVar123._0_4_ = fVar245 * (float)local_3b8._0_4_;
      auVar123._4_4_ = fVar230 * (float)local_3b8._4_4_;
      auVar123._8_4_ = fVar240 * fStack_3b0;
      auVar123._12_4_ = fVar241 * fStack_3ac;
      auVar72 = vfmadd231ps_fma(auVar149,auVar73,local_348);
      auVar74 = vfmadd231ps_fma(auVar164,auVar73,local_358);
      auVar75 = vfmadd231ps_fma(auVar180,auVar73,local_368);
      auVar73 = vfmadd231ps_fma(auVar123,auVar73,local_378);
      auVar139._16_16_ = auVar72;
      auVar139._0_16_ = auVar72;
      auVar155._16_16_ = auVar74;
      auVar155._0_16_ = auVar74;
      auVar167._16_16_ = auVar75;
      auVar167._0_16_ = auVar75;
      auVar72 = vbroadcastss_avx512vl(auVar68);
      uVar111 = auVar67._0_4_;
      auVar195._20_4_ = uVar111;
      auVar195._16_4_ = uVar111;
      auVar195._24_4_ = uVar111;
      auVar195._28_4_ = uVar111;
      auVar195._0_16_ = auVar72;
      auVar95 = vsubps_avx(auVar155,auVar139);
      auVar74 = vfmadd213ps_fma(auVar95,auVar195,auVar139);
      auVar95 = vsubps_avx(auVar167,auVar155);
      auVar76 = vfmadd213ps_fma(auVar95,auVar195,auVar155);
      auVar72 = vsubps_avx(auVar73,auVar75);
      auVar156._16_16_ = auVar72;
      auVar156._0_16_ = auVar72;
      auVar72 = vfmadd213ps_fma(auVar156,auVar195,auVar167);
      auVar95 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar74));
      auVar73 = vfmadd213ps_fma(auVar95,auVar195,ZEXT1632(auVar74));
      auVar95 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar76));
      auVar72 = vfmadd213ps_fma(auVar95,auVar195,ZEXT1632(auVar76));
      auVar95 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar73));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar95,auVar195);
      auVar95 = vmulps_avx512vl(auVar95,auVar281._0_32_);
      auVar72 = vmulss_avx512f(auVar70,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar245 = auVar72._0_4_;
      auVar181._0_8_ =
           CONCAT44(auVar65._4_4_ + fVar245 * auVar95._4_4_,auVar65._0_4_ + fVar245 * auVar95._0_4_)
      ;
      auVar181._8_4_ = auVar65._8_4_ + fVar245 * auVar95._8_4_;
      auVar181._12_4_ = auVar65._12_4_ + fVar245 * auVar95._12_4_;
      auVar150._0_4_ = fVar245 * auVar95._16_4_;
      auVar150._4_4_ = fVar245 * auVar95._20_4_;
      auVar150._8_4_ = fVar245 * auVar95._24_4_;
      auVar150._12_4_ = fVar245 * auVar95._28_4_;
      auVar61 = vsubps_avx((undefined1  [16])0x0,auVar150);
      auVar56 = vshufpd_avx(auVar65,auVar65,3);
      auVar57 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar72 = vsubps_avx(auVar56,auVar65);
      auVar73 = vsubps_avx(auVar57,(undefined1  [16])0x0);
      auVar199._0_4_ = auVar73._0_4_ + auVar72._0_4_;
      auVar199._4_4_ = auVar73._4_4_ + auVar72._4_4_;
      auVar199._8_4_ = auVar73._8_4_ + auVar72._8_4_;
      auVar199._12_4_ = auVar73._12_4_ + auVar72._12_4_;
      auVar72 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar73 = vshufps_avx(auVar181,auVar181,0xb1);
      auVar74 = vshufps_avx(auVar61,auVar61,0xb1);
      auVar75 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar255._4_4_ = auVar199._0_4_;
      auVar255._0_4_ = auVar199._0_4_;
      auVar255._8_4_ = auVar199._0_4_;
      auVar255._12_4_ = auVar199._0_4_;
      auVar76 = vshufps_avx(auVar199,auVar199,0x55);
      fVar245 = auVar76._0_4_;
      auVar211._0_4_ = auVar72._0_4_ * fVar245;
      fVar230 = auVar76._4_4_;
      auVar211._4_4_ = auVar72._4_4_ * fVar230;
      fVar240 = auVar76._8_4_;
      auVar211._8_4_ = auVar72._8_4_ * fVar240;
      fVar241 = auVar76._12_4_;
      auVar211._12_4_ = auVar72._12_4_ * fVar241;
      auVar225._0_4_ = auVar73._0_4_ * fVar245;
      auVar225._4_4_ = auVar73._4_4_ * fVar230;
      auVar225._8_4_ = auVar73._8_4_ * fVar240;
      auVar225._12_4_ = auVar73._12_4_ * fVar241;
      auVar232._0_4_ = auVar74._0_4_ * fVar245;
      auVar232._4_4_ = auVar74._4_4_ * fVar230;
      auVar232._8_4_ = auVar74._8_4_ * fVar240;
      auVar232._12_4_ = auVar74._12_4_ * fVar241;
      auVar200._0_4_ = auVar75._0_4_ * fVar245;
      auVar200._4_4_ = auVar75._4_4_ * fVar230;
      auVar200._8_4_ = auVar75._8_4_ * fVar240;
      auVar200._12_4_ = auVar75._12_4_ * fVar241;
      auVar72 = vfmadd231ps_fma(auVar211,auVar255,auVar65);
      auVar73 = vfmadd231ps_fma(auVar225,auVar255,auVar181);
      auVar76 = vfmadd231ps_fma(auVar232,auVar255,auVar61);
      auVar64 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar255);
      auVar55 = vshufpd_avx(auVar72,auVar72,1);
      auVar58 = vshufpd_avx(auVar73,auVar73,1);
      auVar59 = vshufpd_avx(auVar76,auVar76,1);
      auVar60 = vshufpd_avx(auVar64,auVar64,1);
      auVar74 = vminss_avx(auVar72,auVar73);
      auVar72 = vmaxss_avx(auVar73,auVar72);
      auVar75 = vminss_avx(auVar76,auVar64);
      auVar73 = vmaxss_avx(auVar64,auVar76);
      auVar75 = vminss_avx(auVar74,auVar75);
      auVar72 = vmaxss_avx(auVar73,auVar72);
      auVar76 = vminss_avx(auVar55,auVar58);
      auVar73 = vmaxss_avx(auVar58,auVar55);
      auVar55 = vminss_avx(auVar59,auVar60);
      auVar74 = vmaxss_avx(auVar60,auVar59);
      auVar76 = vminss_avx(auVar76,auVar55);
      auVar73 = vmaxss_avx(auVar74,auVar73);
      vucomiss_avx512f(auVar75);
      if ((uVar48 < 5) || (auVar73 = vucomiss_avx512f(auVar53), uVar48 < 5)) {
        auVar72 = vucomiss_avx512f(auVar53);
        uVar16 = vcmpps_avx512vl(auVar76,auVar54,1);
        uVar17 = vcmpps_avx512vl(auVar75,auVar54,1);
        if ((4 < uVar48 & ((byte)uVar17 | (byte)uVar16)) != 0) goto LAB_01c5d040;
        uVar16 = vcmpps_avx512vl(auVar53,auVar73,5);
        uVar17 = vcmpps_avx512vl(auVar76,auVar54,5);
        if ((((ushort)uVar17 | (ushort)uVar16) & 1) == 0) goto LAB_01c5d040;
        bVar18 = true;
        auVar280 = ZEXT1664(auVar279);
      }
      else {
LAB_01c5d040:
        uVar16 = vcmpss_avx512f(auVar75,auVar66,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        iVar109 = auVar283._0_4_;
        fVar245 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar109);
        uVar16 = vcmpss_avx512f(auVar72,auVar66,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar230 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar109);
        bVar18 = fVar245 != fVar230;
        iVar286 = auVar287._0_4_;
        auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar98._4_28_ = auVar95._4_28_;
        auVar98._0_4_ = (uint)bVar18 * iVar286 + (uint)!bVar18 * 0x7f800000;
        auVar54 = auVar98._0_16_;
        auVar100._16_16_ = auVar95._16_16_;
        auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar18 * iVar286 + (uint)!bVar18 * -0x800000;
        auVar53 = auVar99._0_16_;
        uVar16 = vcmpss_avx512f(auVar76,auVar66,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar240 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar109);
        if ((fVar245 != fVar240) || (NAN(fVar245) || NAN(fVar240))) {
          fVar241 = auVar76._0_4_;
          fVar245 = auVar75._0_4_;
          bVar18 = fVar241 == fVar245;
          if ((!bVar18) || (NAN(fVar241) || NAN(fVar245))) {
            auVar36._8_4_ = 0x80000000;
            auVar36._0_8_ = 0x8000000080000000;
            auVar36._12_4_ = 0x80000000;
            auVar74 = vxorps_avx512vl(auVar75,auVar36);
            auVar271._0_4_ = auVar74._0_4_ / (fVar241 - fVar245);
            auVar271._4_12_ = auVar74._4_12_;
            auVar74 = vsubss_avx512f(auVar71,auVar271);
            auVar75 = vfmadd213ss_avx512f(auVar74,auVar66,auVar271);
            auVar74 = auVar75;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar102._16_16_ = auVar95._16_16_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar18 * iVar286 + (uint)!bVar18 * 0x7f800000;
            auVar75 = auVar101._0_16_;
            auVar74 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar54 = vminss_avx(auVar54,auVar75);
          auVar53 = vmaxss_avx(auVar74,auVar53);
        }
        auVar280 = ZEXT1664(auVar279);
        uVar16 = vcmpss_avx512f(auVar73,auVar66,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        fVar245 = (float)((uint)bVar18 * -0x40800000 + (uint)!bVar18 * iVar109);
        if ((fVar230 != fVar245) || (NAN(fVar230) || NAN(fVar245))) {
          fVar241 = auVar73._0_4_;
          fVar230 = auVar72._0_4_;
          bVar18 = fVar241 == fVar230;
          if ((!bVar18) || (NAN(fVar241) || NAN(fVar230))) {
            auVar35._8_4_ = 0x80000000;
            auVar35._0_8_ = 0x8000000080000000;
            auVar35._12_4_ = 0x80000000;
            auVar72 = vxorps_avx512vl(auVar72,auVar35);
            auVar233._0_4_ = auVar72._0_4_ / (fVar241 - fVar230);
            auVar233._4_12_ = auVar72._4_12_;
            auVar72 = vsubss_avx512f(auVar71,auVar233);
            auVar73 = vfmadd213ss_avx512f(auVar72,auVar66,auVar233);
            auVar72 = auVar73;
          }
          else {
            vucomiss_avx512f(auVar66);
            auVar104._16_16_ = auVar95._16_16_;
            auVar104._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar18 * iVar286 + (uint)!bVar18 * 0x7f800000;
            auVar73 = auVar103._0_16_;
            auVar72 = ZEXT416((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * -0x800000);
          }
          auVar54 = vminss_avx(auVar54,auVar73);
          auVar53 = vmaxss_avx(auVar72,auVar53);
        }
        bVar18 = fVar240 != fVar245;
        auVar72 = vminss_avx512f(auVar54,auVar71);
        auVar106._16_16_ = auVar95._16_16_;
        auVar106._0_16_ = auVar54;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar18 * auVar72._0_4_ + (uint)!bVar18 * auVar54._0_4_;
        auVar54 = vmaxss_avx512f(auVar71,auVar53);
        auVar108._16_16_ = auVar95._16_16_;
        auVar108._0_16_ = auVar53;
        auVar107._4_28_ = auVar108._4_28_;
        auVar107._0_4_ = (uint)bVar18 * auVar54._0_4_ + (uint)!bVar18 * auVar53._0_4_;
        auVar53 = vmaxss_avx512f(auVar66,auVar105._0_16_);
        auVar54 = vminss_avx512f(auVar107._0_16_,auVar71);
        bVar18 = true;
        if (auVar53._0_4_ <= auVar54._0_4_) {
          auVar58 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar53._0_4_ + -0.1)));
          auVar59 = vminss_avx512f(ZEXT416((uint)(auVar54._0_4_ + 0.1)),auVar71);
          auVar124._0_8_ = auVar65._0_8_;
          auVar124._8_8_ = auVar124._0_8_;
          auVar226._8_8_ = auVar181._0_8_;
          auVar226._0_8_ = auVar181._0_8_;
          auVar234._8_8_ = auVar61._0_8_;
          auVar234._0_8_ = auVar61._0_8_;
          auVar53 = vshufpd_avx(auVar181,auVar181,3);
          auVar54 = vshufpd_avx(auVar61,auVar61,3);
          auVar72 = vshufps_avx(auVar58,auVar59,0);
          auVar256._8_4_ = 0x3f800000;
          auVar256._0_8_ = &DAT_3f8000003f800000;
          auVar256._12_4_ = 0x3f800000;
          auVar73 = vsubps_avx(auVar256,auVar72);
          fVar245 = auVar72._0_4_;
          auVar265._0_4_ = fVar245 * auVar56._0_4_;
          fVar230 = auVar72._4_4_;
          auVar265._4_4_ = fVar230 * auVar56._4_4_;
          fVar240 = auVar72._8_4_;
          auVar265._8_4_ = fVar240 * auVar56._8_4_;
          fVar241 = auVar72._12_4_;
          auVar265._12_4_ = fVar241 * auVar56._12_4_;
          auVar182._0_4_ = fVar245 * auVar53._0_4_;
          auVar182._4_4_ = fVar230 * auVar53._4_4_;
          auVar182._8_4_ = fVar240 * auVar53._8_4_;
          auVar182._12_4_ = fVar241 * auVar53._12_4_;
          auVar192._0_4_ = fVar245 * auVar54._0_4_;
          auVar192._4_4_ = fVar230 * auVar54._4_4_;
          auVar192._8_4_ = fVar240 * auVar54._8_4_;
          auVar192._12_4_ = fVar241 * auVar54._12_4_;
          auVar151._0_4_ = fVar245 * auVar57._0_4_;
          auVar151._4_4_ = fVar230 * auVar57._4_4_;
          auVar151._8_4_ = fVar240 * auVar57._8_4_;
          auVar151._12_4_ = fVar241 * auVar57._12_4_;
          auVar74 = vfmadd231ps_fma(auVar265,auVar73,auVar124);
          auVar75 = vfmadd231ps_fma(auVar182,auVar73,auVar226);
          auVar76 = vfmadd231ps_fma(auVar192,auVar73,auVar234);
          auVar55 = vfmadd231ps_fma(auVar151,auVar73,ZEXT816(0));
          auVar54 = vsubss_avx512f(auVar71,auVar58);
          auVar53 = vmovshdup_avx(auVar279);
          auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar58._0_4_)),auVar279,auVar54)
          ;
          auVar54 = vsubss_avx512f(auVar71,auVar59);
          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * auVar53._0_4_)),auVar279,auVar54)
          ;
          auVar73 = vdivss_avx512f(auVar71,auVar70);
          auVar53 = vsubps_avx(auVar75,auVar74);
          auVar133._0_4_ = auVar53._0_4_ * 3.0;
          auVar133._4_4_ = auVar53._4_4_ * 3.0;
          auVar133._8_4_ = auVar53._8_4_ * 3.0;
          auVar133._12_4_ = auVar53._12_4_ * 3.0;
          auVar53 = vsubps_avx(auVar76,auVar75);
          auVar201._0_4_ = auVar53._0_4_ * 3.0;
          auVar201._4_4_ = auVar53._4_4_ * 3.0;
          auVar201._8_4_ = auVar53._8_4_ * 3.0;
          auVar201._12_4_ = auVar53._12_4_ * 3.0;
          auVar53 = vsubps_avx(auVar55,auVar76);
          auVar212._0_4_ = auVar53._0_4_ * 3.0;
          auVar212._4_4_ = auVar53._4_4_ * 3.0;
          auVar212._8_4_ = auVar53._8_4_ * 3.0;
          auVar212._12_4_ = auVar53._12_4_ * 3.0;
          auVar54 = vminps_avx(auVar201,auVar212);
          auVar53 = vmaxps_avx(auVar201,auVar212);
          auVar54 = vminps_avx(auVar133,auVar54);
          auVar53 = vmaxps_avx(auVar133,auVar53);
          auVar70 = vshufpd_avx(auVar54,auVar54,3);
          auVar72 = vshufpd_avx(auVar53,auVar53,3);
          auVar54 = vminps_avx(auVar54,auVar70);
          auVar53 = vmaxps_avx(auVar53,auVar72);
          fVar245 = auVar73._0_4_;
          auVar213._0_4_ = fVar245 * auVar54._0_4_;
          auVar213._4_4_ = fVar245 * auVar54._4_4_;
          auVar213._8_4_ = fVar245 * auVar54._8_4_;
          auVar213._12_4_ = fVar245 * auVar54._12_4_;
          auVar202._0_4_ = fVar245 * auVar53._0_4_;
          auVar202._4_4_ = fVar245 * auVar53._4_4_;
          auVar202._8_4_ = fVar245 * auVar53._8_4_;
          auVar202._12_4_ = fVar245 * auVar53._12_4_;
          auVar56 = vdivss_avx512f(auVar71,ZEXT416((uint)(auVar61._0_4_ - auVar60._0_4_)));
          auVar53 = vshufpd_avx(auVar74,auVar74,3);
          auVar54 = vshufpd_avx(auVar75,auVar75,3);
          auVar70 = vshufpd_avx(auVar76,auVar76,3);
          auVar72 = vshufpd_avx(auVar55,auVar55,3);
          auVar53 = vsubps_avx(auVar53,auVar74);
          auVar73 = vsubps_avx(auVar54,auVar75);
          auVar74 = vsubps_avx(auVar70,auVar76);
          auVar72 = vsubps_avx(auVar72,auVar55);
          auVar54 = vminps_avx(auVar53,auVar73);
          auVar53 = vmaxps_avx(auVar53,auVar73);
          auVar70 = vminps_avx(auVar74,auVar72);
          auVar70 = vminps_avx(auVar54,auVar70);
          auVar54 = vmaxps_avx(auVar74,auVar72);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          fVar245 = auVar56._0_4_;
          auVar235._0_4_ = fVar245 * auVar70._0_4_;
          auVar235._4_4_ = fVar245 * auVar70._4_4_;
          auVar235._8_4_ = fVar245 * auVar70._8_4_;
          auVar235._12_4_ = fVar245 * auVar70._12_4_;
          auVar247._0_4_ = fVar245 * auVar53._0_4_;
          auVar247._4_4_ = fVar245 * auVar53._4_4_;
          auVar247._8_4_ = fVar245 * auVar53._8_4_;
          auVar247._12_4_ = fVar245 * auVar53._12_4_;
          auVar59 = vinsertps_avx512f(auVar68,auVar60,0x10);
          auVar73 = vinsertps_avx(auVar67,auVar61,0x10);
          auVar115._0_4_ = auVar59._0_4_ + auVar73._0_4_;
          auVar115._4_4_ = auVar59._4_4_ + auVar73._4_4_;
          auVar115._8_4_ = auVar59._8_4_ + auVar73._8_4_;
          auVar115._12_4_ = auVar59._12_4_ + auVar73._12_4_;
          auVar57 = vmulps_avx512vl(auVar115,auVar285._0_16_);
          auVar70 = vshufps_avx(auVar57,auVar57,0x54);
          uVar111 = auVar57._0_4_;
          auVar134._4_4_ = uVar111;
          auVar134._0_4_ = uVar111;
          auVar134._8_4_ = uVar111;
          auVar134._12_4_ = uVar111;
          auVar72 = vfmadd213ps_avx512vl(local_158,auVar134,auVar63);
          auVar74 = vfmadd213ps_avx512vl(local_168,auVar134,auVar62);
          auVar54 = vfmadd213ps_fma(local_178,auVar134,auVar69);
          auVar53 = vsubps_avx(auVar74,auVar72);
          auVar72 = vfmadd213ps_fma(auVar53,auVar134,auVar72);
          auVar53 = vsubps_avx(auVar54,auVar74);
          auVar53 = vfmadd213ps_fma(auVar53,auVar134,auVar74);
          auVar53 = vsubps_avx(auVar53,auVar72);
          auVar54 = vfmadd231ps_fma(auVar72,auVar53,auVar134);
          auVar135._0_8_ = CONCAT44(auVar53._4_4_ * 3.0,auVar53._0_4_ * 3.0);
          auVar135._8_4_ = auVar53._8_4_ * 3.0;
          auVar135._12_4_ = auVar53._12_4_ * 3.0;
          auVar257._8_8_ = auVar54._0_8_;
          auVar257._0_8_ = auVar54._0_8_;
          auVar53 = vshufpd_avx(auVar54,auVar54,3);
          auVar54 = vshufps_avx(auVar57,auVar57,0x55);
          auVar72 = vsubps_avx(auVar53,auVar257);
          auVar74 = vfmadd231ps_fma(auVar257,auVar54,auVar72);
          auVar272._8_8_ = auVar135._0_8_;
          auVar272._0_8_ = auVar135._0_8_;
          auVar53 = vshufpd_avx(auVar135,auVar135,3);
          auVar53 = vsubps_avx(auVar53,auVar272);
          auVar54 = vfmadd213ps_fma(auVar53,auVar54,auVar272);
          auVar136._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
          auVar136._8_4_ = auVar72._8_4_ ^ 0x80000000;
          auVar136._12_4_ = auVar72._12_4_ ^ 0x80000000;
          auVar53 = vmovshdup_avx(auVar54);
          auVar273._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
          auVar273._8_4_ = auVar53._8_4_ ^ 0x80000000;
          auVar273._12_4_ = auVar53._12_4_ ^ 0x80000000;
          auVar75 = vmovshdup_avx512vl(auVar72);
          auVar76 = vpermt2ps_avx512vl(auVar273,ZEXT416(5),auVar72);
          auVar53 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar72._0_4_)),auVar54,
                                        auVar75);
          auVar54 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar136);
          auVar152._0_4_ = auVar53._0_4_;
          auVar152._4_4_ = auVar152._0_4_;
          auVar152._8_4_ = auVar152._0_4_;
          auVar152._12_4_ = auVar152._0_4_;
          auVar53 = vdivps_avx(auVar76,auVar152);
          auVar54 = vdivps_avx(auVar54,auVar152);
          fVar230 = auVar74._0_4_;
          auVar72 = vshufps_avx(auVar74,auVar74,0x55);
          fVar245 = auVar54._0_4_;
          auVar258._0_4_ = fVar230 * auVar53._0_4_ + auVar72._0_4_ * fVar245;
          auVar258._4_4_ = fVar230 * auVar53._4_4_ + auVar72._4_4_ * auVar54._4_4_;
          auVar258._8_4_ = fVar230 * auVar53._8_4_ + auVar72._8_4_ * auVar54._8_4_;
          auVar258._12_4_ = fVar230 * auVar53._12_4_ + auVar72._12_4_ * auVar54._12_4_;
          auVar58 = vsubps_avx(auVar70,auVar258);
          auVar74 = vmovshdup_avx(auVar53);
          auVar70 = vinsertps_avx(auVar213,auVar235,0x1c);
          auVar274._0_4_ = auVar74._0_4_ * auVar70._0_4_;
          auVar274._4_4_ = auVar74._4_4_ * auVar70._4_4_;
          auVar274._8_4_ = auVar74._8_4_ * auVar70._8_4_;
          auVar274._12_4_ = auVar74._12_4_ * auVar70._12_4_;
          auVar72 = vinsertps_avx(auVar202,auVar247,0x1c);
          auVar259._0_4_ = auVar74._0_4_ * auVar72._0_4_;
          auVar259._4_4_ = auVar74._4_4_ * auVar72._4_4_;
          auVar259._8_4_ = auVar74._8_4_ * auVar72._8_4_;
          auVar259._12_4_ = auVar74._12_4_ * auVar72._12_4_;
          auVar56 = vminps_avx512vl(auVar274,auVar259);
          auVar76 = vmaxps_avx(auVar259,auVar274);
          auVar55 = vmovshdup_avx(auVar54);
          auVar74 = vinsertps_avx(auVar235,auVar213,0x4c);
          auVar236._0_4_ = auVar55._0_4_ * auVar74._0_4_;
          auVar236._4_4_ = auVar55._4_4_ * auVar74._4_4_;
          auVar236._8_4_ = auVar55._8_4_ * auVar74._8_4_;
          auVar236._12_4_ = auVar55._12_4_ * auVar74._12_4_;
          auVar75 = vinsertps_avx(auVar247,auVar202,0x4c);
          auVar248._0_4_ = auVar55._0_4_ * auVar75._0_4_;
          auVar248._4_4_ = auVar55._4_4_ * auVar75._4_4_;
          auVar248._8_4_ = auVar55._8_4_ * auVar75._8_4_;
          auVar248._12_4_ = auVar55._12_4_ * auVar75._12_4_;
          auVar55 = vminps_avx(auVar236,auVar248);
          auVar56 = vaddps_avx512vl(auVar56,auVar55);
          auVar55 = vmaxps_avx(auVar248,auVar236);
          auVar237._0_4_ = auVar76._0_4_ + auVar55._0_4_;
          auVar237._4_4_ = auVar76._4_4_ + auVar55._4_4_;
          auVar237._8_4_ = auVar76._8_4_ + auVar55._8_4_;
          auVar237._12_4_ = auVar76._12_4_ + auVar55._12_4_;
          auVar249._8_8_ = 0x3f80000000000000;
          auVar249._0_8_ = 0x3f80000000000000;
          auVar76 = vsubps_avx(auVar249,auVar237);
          auVar55 = vsubps_avx(auVar249,auVar56);
          auVar56 = vsubps_avx(auVar59,auVar57);
          auVar57 = vsubps_avx(auVar73,auVar57);
          fVar243 = auVar56._0_4_;
          auVar275._0_4_ = fVar243 * auVar76._0_4_;
          fVar244 = auVar56._4_4_;
          auVar275._4_4_ = fVar244 * auVar76._4_4_;
          fVar157 = auVar56._8_4_;
          auVar275._8_4_ = fVar157 * auVar76._8_4_;
          fVar158 = auVar56._12_4_;
          auVar275._12_4_ = fVar158 * auVar76._12_4_;
          auVar64 = vbroadcastss_avx512vl(auVar53);
          auVar70 = vmulps_avx512vl(auVar64,auVar70);
          auVar72 = vmulps_avx512vl(auVar64,auVar72);
          auVar64 = vminps_avx512vl(auVar70,auVar72);
          auVar70 = vmaxps_avx(auVar72,auVar70);
          auVar214._0_4_ = fVar245 * auVar74._0_4_;
          auVar214._4_4_ = fVar245 * auVar74._4_4_;
          auVar214._8_4_ = fVar245 * auVar74._8_4_;
          auVar214._12_4_ = fVar245 * auVar74._12_4_;
          auVar203._0_4_ = fVar245 * auVar75._0_4_;
          auVar203._4_4_ = fVar245 * auVar75._4_4_;
          auVar203._8_4_ = fVar245 * auVar75._8_4_;
          auVar203._12_4_ = fVar245 * auVar75._12_4_;
          auVar72 = vminps_avx(auVar214,auVar203);
          auVar74 = vaddps_avx512vl(auVar64,auVar72);
          auVar75 = vmulps_avx512vl(auVar56,auVar55);
          fVar230 = auVar57._0_4_;
          auVar238._0_4_ = fVar230 * auVar76._0_4_;
          fVar240 = auVar57._4_4_;
          auVar238._4_4_ = fVar240 * auVar76._4_4_;
          fVar241 = auVar57._8_4_;
          auVar238._8_4_ = fVar241 * auVar76._8_4_;
          fVar242 = auVar57._12_4_;
          auVar238._12_4_ = fVar242 * auVar76._12_4_;
          auVar250._0_4_ = fVar230 * auVar55._0_4_;
          auVar250._4_4_ = fVar240 * auVar55._4_4_;
          auVar250._8_4_ = fVar241 * auVar55._8_4_;
          auVar250._12_4_ = fVar242 * auVar55._12_4_;
          auVar72 = vmaxps_avx(auVar203,auVar214);
          auVar204._0_4_ = auVar70._0_4_ + auVar72._0_4_;
          auVar204._4_4_ = auVar70._4_4_ + auVar72._4_4_;
          auVar204._8_4_ = auVar70._8_4_ + auVar72._8_4_;
          auVar204._12_4_ = auVar70._12_4_ + auVar72._12_4_;
          auVar215._8_8_ = 0x3f800000;
          auVar215._0_8_ = 0x3f800000;
          auVar70 = vsubps_avx(auVar215,auVar204);
          auVar72 = vsubps_avx(auVar215,auVar74);
          auVar266._0_4_ = fVar243 * auVar70._0_4_;
          auVar266._4_4_ = fVar244 * auVar70._4_4_;
          auVar266._8_4_ = fVar157 * auVar70._8_4_;
          auVar266._12_4_ = fVar158 * auVar70._12_4_;
          auVar260._0_4_ = fVar243 * auVar72._0_4_;
          auVar260._4_4_ = fVar244 * auVar72._4_4_;
          auVar260._8_4_ = fVar157 * auVar72._8_4_;
          auVar260._12_4_ = fVar158 * auVar72._12_4_;
          auVar205._0_4_ = fVar230 * auVar70._0_4_;
          auVar205._4_4_ = fVar240 * auVar70._4_4_;
          auVar205._8_4_ = fVar241 * auVar70._8_4_;
          auVar205._12_4_ = fVar242 * auVar70._12_4_;
          auVar216._0_4_ = fVar230 * auVar72._0_4_;
          auVar216._4_4_ = fVar240 * auVar72._4_4_;
          auVar216._8_4_ = fVar241 * auVar72._8_4_;
          auVar216._12_4_ = fVar242 * auVar72._12_4_;
          auVar70 = vminps_avx(auVar266,auVar260);
          auVar72 = vminps_avx(auVar205,auVar216);
          auVar74 = vminps_avx(auVar70,auVar72);
          auVar70 = vmaxps_avx(auVar260,auVar266);
          auVar72 = vmaxps_avx(auVar216,auVar205);
          auVar72 = vmaxps_avx(auVar72,auVar70);
          auVar76 = vminps_avx512vl(auVar275,auVar75);
          auVar70 = vminps_avx(auVar238,auVar250);
          auVar70 = vminps_avx(auVar76,auVar70);
          auVar70 = vhaddps_avx(auVar74,auVar70);
          auVar75 = vmaxps_avx512vl(auVar75,auVar275);
          auVar74 = vmaxps_avx(auVar250,auVar238);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar72 = vhaddps_avx(auVar72,auVar74);
          auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
          auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
          auVar206._0_4_ = auVar70._0_4_ + auVar58._0_4_;
          auVar206._4_4_ = auVar70._4_4_ + auVar58._4_4_;
          auVar206._8_4_ = auVar70._8_4_ + auVar58._8_4_;
          auVar206._12_4_ = auVar70._12_4_ + auVar58._12_4_;
          auVar217._0_4_ = auVar72._0_4_ + auVar58._0_4_;
          auVar217._4_4_ = auVar72._4_4_ + auVar58._4_4_;
          auVar217._8_4_ = auVar72._8_4_ + auVar58._8_4_;
          auVar217._12_4_ = auVar72._12_4_ + auVar58._12_4_;
          auVar70 = vmaxps_avx(auVar59,auVar206);
          auVar72 = vminps_avx(auVar217,auVar73);
          uVar52 = vcmpps_avx512vl(auVar72,auVar70,1);
          auVar70 = vinsertps_avx(auVar60,auVar61,0x10);
          auVar280 = ZEXT1664(auVar70);
          if ((uVar52 & 3) == 0) {
            vucomiss_avx512f(auVar68);
            if (uVar48 < 4 && (uVar6 == 0 || lVar46 == 0)) {
              bVar18 = false;
            }
            else {
              lVar46 = 200;
              do {
                auVar72 = vsubss_avx512f(auVar71,auVar58);
                fVar241 = auVar72._0_4_;
                fVar230 = fVar241 * fVar241 * fVar241;
                fVar242 = auVar58._0_4_;
                fVar240 = fVar242 * 3.0 * fVar241 * fVar241;
                fVar241 = fVar241 * fVar242 * fVar242 * 3.0;
                auVar183._4_4_ = fVar230;
                auVar183._0_4_ = fVar230;
                auVar183._8_4_ = fVar230;
                auVar183._12_4_ = fVar230;
                auVar165._4_4_ = fVar240;
                auVar165._0_4_ = fVar240;
                auVar165._8_4_ = fVar240;
                auVar165._12_4_ = fVar240;
                auVar125._4_4_ = fVar241;
                auVar125._0_4_ = fVar241;
                auVar125._8_4_ = fVar241;
                auVar125._12_4_ = fVar241;
                fVar242 = fVar242 * fVar242 * fVar242;
                auVar193._0_4_ = (float)local_3c8._0_4_ * fVar242;
                auVar193._4_4_ = (float)local_3c8._4_4_ * fVar242;
                auVar193._8_4_ = fStack_3c0 * fVar242;
                auVar193._12_4_ = fStack_3bc * fVar242;
                auVar72 = vfmadd231ps_fma(auVar193,auVar69,auVar125);
                auVar72 = vfmadd231ps_avx512vl(auVar72,auVar62,auVar165);
                auVar72 = vfmadd231ps_avx512vl(auVar72,auVar63,auVar183);
                auVar126._8_8_ = auVar72._0_8_;
                auVar126._0_8_ = auVar72._0_8_;
                auVar72 = vshufpd_avx(auVar72,auVar72,3);
                auVar73 = vshufps_avx(auVar58,auVar58,0x55);
                auVar72 = vsubps_avx(auVar72,auVar126);
                auVar73 = vfmadd213ps_fma(auVar72,auVar73,auVar126);
                fVar230 = auVar73._0_4_;
                auVar72 = vshufps_avx(auVar73,auVar73,0x55);
                auVar127._0_4_ = auVar53._0_4_ * fVar230 + fVar245 * auVar72._0_4_;
                auVar127._4_4_ = auVar53._4_4_ * fVar230 + auVar54._4_4_ * auVar72._4_4_;
                auVar127._8_4_ = auVar53._8_4_ * fVar230 + auVar54._8_4_ * auVar72._8_4_;
                auVar127._12_4_ = auVar53._12_4_ * fVar230 + auVar54._12_4_ * auVar72._12_4_;
                auVar58 = vsubps_avx(auVar58,auVar127);
                auVar72 = vandps_avx512vl(auVar73,auVar282._0_16_);
                auVar73 = vprolq_avx512vl(auVar72,0x20);
                auVar72 = vmaxss_avx(auVar73,auVar72);
                bVar50 = auVar72._0_4_ <= (float)local_3d8._0_4_;
                if (auVar72._0_4_ < (float)local_3d8._0_4_) {
                  auVar53 = vucomiss_avx512f(auVar66);
                  if (bVar50) {
                    auVar54 = vucomiss_avx512f(auVar53);
                    auVar283 = ZEXT1664(auVar54);
                    if (bVar50) {
                      vmovshdup_avx(auVar53);
                      auVar54 = vucomiss_avx512f(auVar66);
                      if (bVar50) {
                        auVar71 = vucomiss_avx512f(auVar54);
                        auVar283 = ZEXT1664(auVar71);
                        if (bVar50) {
                          auVar72 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar57 = vinsertps_avx(auVar72,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar72 = vdpps_avx(auVar57,local_188,0x7f);
                          auVar73 = vdpps_avx(auVar57,local_198,0x7f);
                          auVar74 = vdpps_avx(auVar57,local_1a8,0x7f);
                          auVar75 = vdpps_avx(auVar57,local_1b8,0x7f);
                          auVar76 = vdpps_avx(auVar57,local_1c8,0x7f);
                          auVar55 = vdpps_avx(auVar57,local_1d8,0x7f);
                          auVar56 = vdpps_avx(auVar57,local_1e8,0x7f);
                          auVar57 = vdpps_avx(auVar57,local_1f8,0x7f);
                          auVar58 = vsubss_avx512f(auVar71,auVar54);
                          fVar245 = auVar54._0_4_;
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar245 * auVar76._0_4_)),auVar58
                                                    ,auVar72);
                          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar245)),auVar58
                                                    ,auVar73);
                          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar245)),auVar58
                                                    ,auVar74);
                          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar245 * auVar57._0_4_)),auVar58
                                                    ,auVar75);
                          auVar71 = vsubss_avx512f(auVar71,auVar53);
                          auVar207._0_4_ = auVar71._0_4_;
                          fVar245 = auVar207._0_4_ * auVar207._0_4_ * auVar207._0_4_;
                          local_f8 = auVar53._0_4_;
                          fVar230 = local_f8 * 3.0 * auVar207._0_4_ * auVar207._0_4_;
                          fVar240 = auVar207._0_4_ * local_f8 * local_f8 * 3.0;
                          fVar242 = local_f8 * local_f8 * local_f8;
                          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * auVar74._0_4_)),
                                                    ZEXT416((uint)fVar240),auVar73);
                          auVar71 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar230),auVar72);
                          auVar54 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar245),auVar54);
                          fVar241 = auVar54._0_4_;
                          if ((fVar110 <= fVar241) &&
                             (fVar243 = *(float *)(ray + k * 4 + 0x80), fVar241 <= fVar243)) {
                            local_e8 = vshufps_avx(auVar53,auVar53,0x55);
                            auVar218._8_4_ = 0x3f800000;
                            auVar218._0_8_ = &DAT_3f8000003f800000;
                            auVar218._12_4_ = 0x3f800000;
                            auVar53 = vsubps_avx(auVar218,local_e8);
                            fVar244 = local_e8._0_4_;
                            auVar227._0_4_ = fVar244 * (float)local_248._0_4_;
                            fVar157 = local_e8._4_4_;
                            auVar227._4_4_ = fVar157 * (float)local_248._4_4_;
                            fVar158 = local_e8._8_4_;
                            auVar227._8_4_ = fVar158 * fStack_240;
                            fVar159 = local_e8._12_4_;
                            auVar227._12_4_ = fVar159 * fStack_23c;
                            auVar239._0_4_ = fVar244 * (float)local_258._0_4_;
                            auVar239._4_4_ = fVar157 * (float)local_258._4_4_;
                            auVar239._8_4_ = fVar158 * fStack_250;
                            auVar239._12_4_ = fVar159 * fStack_24c;
                            auVar251._0_4_ = fVar244 * (float)local_268._0_4_;
                            auVar251._4_4_ = fVar157 * (float)local_268._4_4_;
                            auVar251._8_4_ = fVar158 * fStack_260;
                            auVar251._12_4_ = fVar159 * fStack_25c;
                            auVar261._0_4_ = fVar244 * (float)local_278._0_4_;
                            auVar261._4_4_ = fVar157 * (float)local_278._4_4_;
                            auVar261._8_4_ = fVar158 * fStack_270;
                            auVar261._12_4_ = fVar159 * fStack_26c;
                            auVar54 = vfmadd231ps_fma(auVar227,auVar53,local_208);
                            auVar71 = vfmadd231ps_fma(auVar239,auVar53,local_218);
                            auVar72 = vfmadd231ps_fma(auVar251,auVar53,local_228);
                            auVar73 = vfmadd231ps_fma(auVar261,auVar53,local_238);
                            auVar53 = vsubps_avx(auVar71,auVar54);
                            auVar54 = vsubps_avx(auVar72,auVar71);
                            auVar71 = vsubps_avx(auVar73,auVar72);
                            auVar252._0_4_ = auVar54._0_4_ * local_f8;
                            auVar252._4_4_ = auVar54._4_4_ * local_f8;
                            auVar252._8_4_ = auVar54._8_4_ * local_f8;
                            auVar252._12_4_ = auVar54._12_4_ * local_f8;
                            auVar207._4_4_ = auVar207._0_4_;
                            auVar207._8_4_ = auVar207._0_4_;
                            auVar207._12_4_ = auVar207._0_4_;
                            auVar53 = vfmadd231ps_fma(auVar252,auVar207,auVar53);
                            auVar219._0_4_ = auVar71._0_4_ * local_f8;
                            auVar219._4_4_ = auVar71._4_4_ * local_f8;
                            auVar219._8_4_ = auVar71._8_4_ * local_f8;
                            auVar219._12_4_ = auVar71._12_4_ * local_f8;
                            auVar54 = vfmadd231ps_fma(auVar219,auVar207,auVar54);
                            auVar220._0_4_ = auVar54._0_4_ * local_f8;
                            auVar220._4_4_ = auVar54._4_4_ * local_f8;
                            auVar220._8_4_ = auVar54._8_4_ * local_f8;
                            auVar220._12_4_ = auVar54._12_4_ * local_f8;
                            auVar53 = vfmadd231ps_fma(auVar220,auVar207,auVar53);
                            auVar34._8_4_ = 0x40400000;
                            auVar34._0_8_ = 0x4040000040400000;
                            auVar34._12_4_ = 0x40400000;
                            auVar53 = vmulps_avx512vl(auVar53,auVar34);
                            pGVar7 = (context->scene->geometries).items[uVar42].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                              bVar50 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar50 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar194._0_4_ = fVar242 * (float)local_2d8._0_4_;
                              auVar194._4_4_ = fVar242 * (float)local_2d8._4_4_;
                              auVar194._8_4_ = fVar242 * fStack_2d0;
                              auVar194._12_4_ = fVar242 * fStack_2cc;
                              auVar184._4_4_ = fVar240;
                              auVar184._0_4_ = fVar240;
                              auVar184._8_4_ = fVar240;
                              auVar184._12_4_ = fVar240;
                              auVar54 = vfmadd132ps_fma(auVar184,auVar194,local_2c8);
                              auVar153._4_4_ = fVar230;
                              auVar153._0_4_ = fVar230;
                              auVar153._8_4_ = fVar230;
                              auVar153._12_4_ = fVar230;
                              auVar54 = vfmadd132ps_fma(auVar153,auVar54,local_2b8);
                              auVar137._4_4_ = fVar245;
                              auVar137._0_4_ = fVar245;
                              auVar137._8_4_ = fVar245;
                              auVar137._12_4_ = fVar245;
                              auVar72 = vfmadd132ps_fma(auVar137,auVar54,local_2a8);
                              auVar54 = vshufps_avx(auVar72,auVar72,0xc9);
                              auVar71 = vshufps_avx(auVar53,auVar53,0xc9);
                              auVar138._0_4_ = auVar72._0_4_ * auVar71._0_4_;
                              auVar138._4_4_ = auVar72._4_4_ * auVar71._4_4_;
                              auVar138._8_4_ = auVar72._8_4_ * auVar71._8_4_;
                              auVar138._12_4_ = auVar72._12_4_ * auVar71._12_4_;
                              auVar54 = vfmsub231ps_fma(auVar138,auVar53,auVar54);
                              auVar53 = vshufps_avx(auVar54,auVar54,0x55);
                              local_118 = vshufps_avx(auVar54,auVar54,0xaa);
                              local_108 = auVar54._0_4_;
                              local_128[0] = (RTCHitN)auVar53[0];
                              local_128[1] = (RTCHitN)auVar53[1];
                              local_128[2] = (RTCHitN)auVar53[2];
                              local_128[3] = (RTCHitN)auVar53[3];
                              local_128[4] = (RTCHitN)auVar53[4];
                              local_128[5] = (RTCHitN)auVar53[5];
                              local_128[6] = (RTCHitN)auVar53[6];
                              local_128[7] = (RTCHitN)auVar53[7];
                              local_128[8] = (RTCHitN)auVar53[8];
                              local_128[9] = (RTCHitN)auVar53[9];
                              local_128[10] = (RTCHitN)auVar53[10];
                              local_128[0xb] = (RTCHitN)auVar53[0xb];
                              local_128[0xc] = (RTCHitN)auVar53[0xc];
                              local_128[0xd] = (RTCHitN)auVar53[0xd];
                              local_128[0xe] = (RTCHitN)auVar53[0xe];
                              local_128[0xf] = (RTCHitN)auVar53[0xf];
                              uStack_104 = local_108;
                              uStack_100 = local_108;
                              uStack_fc = local_108;
                              fStack_f4 = local_f8;
                              fStack_f0 = local_f8;
                              fStack_ec = local_f8;
                              local_d8 = local_298._0_8_;
                              uStack_d0 = local_298._8_8_;
                              local_c8 = local_2e8;
                              vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                              uStack_b4 = context->user->instID[0];
                              local_b8 = uStack_b4;
                              uStack_b0 = uStack_b4;
                              uStack_ac = uStack_b4;
                              uStack_a8 = context->user->instPrimID[0];
                              uStack_a4 = uStack_a8;
                              uStack_a0 = uStack_a8;
                              uStack_9c = uStack_a8;
                              *(float *)(ray + k * 4 + 0x80) = fVar241;
                              local_3f8 = local_2f8._0_8_;
                              uStack_3f0 = local_2f8._8_8_;
                              local_328.valid = (int *)&local_3f8;
                              local_328.geometryUserPtr = pGVar7->userPtr;
                              local_328.context = context->user;
                              local_328.ray = (RTCRayN *)ray;
                              local_328.hit = local_128;
                              local_328.N = 4;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                local_3e8 = uVar42;
                                (*pGVar7->occlusionFilterN)(&local_328);
                                auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar281 = ZEXT3264(auVar95);
                                auVar283 = ZEXT464(0x3f800000);
                                auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar285 = ZEXT1664(auVar53);
                                auVar53 = vxorps_avx512vl(auVar66,auVar66);
                                auVar287 = ZEXT1664(auVar53);
                                auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar282 = ZEXT1664(auVar53);
                                uVar42 = local_3e8;
                              }
                              auVar53 = auVar287._0_16_;
                              auVar38._8_8_ = uStack_3f0;
                              auVar38._0_8_ = local_3f8;
                              uVar52 = vptestmd_avx512vl(auVar38,auVar38);
                              if ((uVar52 & 0xf) == 0) {
                                bVar50 = false;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_328);
                                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar281 = ZEXT3264(auVar95);
                                  auVar283 = ZEXT464(0x3f800000);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar285 = ZEXT1664(auVar54);
                                  auVar53 = vxorps_avx512vl(auVar53,auVar53);
                                  auVar287 = ZEXT1664(auVar53);
                                  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar282 = ZEXT1664(auVar53);
                                }
                                auVar39._8_8_ = uStack_3f0;
                                auVar39._0_8_ = local_3f8;
                                uVar52 = vptestmd_avx512vl(auVar39,auVar39);
                                uVar52 = uVar52 & 0xf;
                                auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar50 = (bool)((byte)uVar52 & 1);
                                bVar13 = (bool)((byte)(uVar52 >> 1) & 1);
                                bVar14 = (bool)((byte)(uVar52 >> 2) & 1);
                                bVar15 = SUB81(uVar52 >> 3,0);
                                *(uint *)(local_328.ray + 0x80) =
                                     (uint)bVar50 * auVar53._0_4_ |
                                     (uint)!bVar50 * *(int *)(local_328.ray + 0x80);
                                *(uint *)(local_328.ray + 0x84) =
                                     (uint)bVar13 * auVar53._4_4_ |
                                     (uint)!bVar13 * *(int *)(local_328.ray + 0x84);
                                *(uint *)(local_328.ray + 0x88) =
                                     (uint)bVar14 * auVar53._8_4_ |
                                     (uint)!bVar14 * *(int *)(local_328.ray + 0x88);
                                *(uint *)(local_328.ray + 0x8c) =
                                     (uint)bVar15 * auVar53._12_4_ |
                                     (uint)!bVar15 * *(int *)(local_328.ray + 0x8c);
                                bVar50 = (byte)uVar52 != 0;
                              }
                              if (!bVar50) {
                                *(float *)(ray + k * 4 + 0x80) = fVar243;
                              }
                            }
                            auVar280 = ZEXT1664(auVar70);
                            bVar49 = (bool)(bVar49 | bVar50);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar46 = lVar46 + -1;
              } while (lVar46 != 0);
            }
          }
        }
      }
    } while (bVar18);
    auVar53 = vinsertps_avx512f(auVar68,auVar67,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }